

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  byte bVar92;
  byte bVar93;
  ulong uVar94;
  uint uVar95;
  uint uVar96;
  ulong uVar97;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar98;
  Geometry *pGVar99;
  uint uVar100;
  ulong uVar101;
  long lVar102;
  byte bVar103;
  float fVar104;
  float fVar105;
  float fVar155;
  float fVar156;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar109 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar110 [16];
  float fVar157;
  float fVar159;
  float fVar160;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar158;
  float fVar161;
  float fVar162;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar163;
  undefined4 uVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined8 uVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar182;
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar196;
  undefined1 auVar195 [64];
  float fVar197;
  float fVar205;
  float fVar206;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_710;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  Geometry *local_6d0;
  undefined1 (*local_6c8) [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined8 uStack_5d8;
  LinearSpace3fa *local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  float local_500;
  undefined1 auStack_4fc [8];
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  int local_47c;
  undefined1 local_470 [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  byte local_430;
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  int local_2e0;
  int iStack_2dc;
  int iStack_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar97 = (ulong)(byte)PVar11;
  fVar197 = *(float *)(prim + uVar97 * 0x19 + 0x12);
  auVar23 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar108 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar179 = vinsertps_avx(auVar108,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar184 = vsubps_avx(auVar23,*(undefined1 (*) [16])(prim + uVar97 * 0x19 + 6));
  fVar182 = fVar197 * auVar184._0_4_;
  fVar163 = fVar197 * auVar179._0_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar97 * 4 + 6);
  auVar116 = vpmovsxbd_avx2(auVar23);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar97 * 5 + 6);
  auVar114 = vpmovsxbd_avx2(auVar108);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar97 * 6 + 6);
  auVar129 = vpmovsxbd_avx2(auVar107);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar130 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar127 = vpmovsxbd_avx2(auVar9);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar128 = vcvtdq2ps_avx(auVar127);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar97 + 6);
  auVar115 = vpmovsxbd_avx2(auVar166);
  auVar115 = vcvtdq2ps_avx(auVar115);
  uVar101 = (ulong)(uint)((int)(uVar97 * 9) * 2);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar101 + 6);
  auVar117 = vpmovsxbd_avx2(auVar165);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar101 + uVar97 + 6);
  auVar118 = vpmovsxbd_avx2(auVar106);
  auVar118 = vcvtdq2ps_avx(auVar118);
  uVar94 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar94 + 6);
  auVar113 = vpmovsxbd_avx2(auVar10);
  auVar119 = vcvtdq2ps_avx(auVar113);
  auVar225._4_4_ = fVar163;
  auVar225._0_4_ = fVar163;
  auVar225._8_4_ = fVar163;
  auVar225._12_4_ = fVar163;
  auVar225._16_4_ = fVar163;
  auVar225._20_4_ = fVar163;
  auVar225._24_4_ = fVar163;
  auVar225._28_4_ = fVar163;
  auVar227._8_4_ = 1;
  auVar227._0_8_ = 0x100000001;
  auVar227._12_4_ = 1;
  auVar227._16_4_ = 1;
  auVar227._20_4_ = 1;
  auVar227._24_4_ = 1;
  auVar227._28_4_ = 1;
  auVar111 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar121 = ZEXT1632(CONCAT412(fVar197 * auVar179._12_4_,
                                CONCAT48(fVar197 * auVar179._8_4_,
                                         CONCAT44(fVar197 * auVar179._4_4_,fVar163))));
  auVar120 = vpermps_avx2(auVar227,auVar121);
  auVar112 = vpermps_avx512vl(auVar111,auVar121);
  fVar163 = auVar112._0_4_;
  fVar205 = auVar112._4_4_;
  auVar121._4_4_ = fVar205 * auVar129._4_4_;
  auVar121._0_4_ = fVar163 * auVar129._0_4_;
  fVar206 = auVar112._8_4_;
  auVar121._8_4_ = fVar206 * auVar129._8_4_;
  fVar183 = auVar112._12_4_;
  auVar121._12_4_ = fVar183 * auVar129._12_4_;
  fVar196 = auVar112._16_4_;
  auVar121._16_4_ = fVar196 * auVar129._16_4_;
  fVar104 = auVar112._20_4_;
  auVar121._20_4_ = fVar104 * auVar129._20_4_;
  fVar105 = auVar112._24_4_;
  auVar121._24_4_ = fVar105 * auVar129._24_4_;
  auVar121._28_4_ = auVar127._28_4_;
  auVar127._4_4_ = auVar115._4_4_ * fVar205;
  auVar127._0_4_ = auVar115._0_4_ * fVar163;
  auVar127._8_4_ = auVar115._8_4_ * fVar206;
  auVar127._12_4_ = auVar115._12_4_ * fVar183;
  auVar127._16_4_ = auVar115._16_4_ * fVar196;
  auVar127._20_4_ = auVar115._20_4_ * fVar104;
  auVar127._24_4_ = auVar115._24_4_ * fVar105;
  auVar127._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar119._4_4_ * fVar205;
  auVar113._0_4_ = auVar119._0_4_ * fVar163;
  auVar113._8_4_ = auVar119._8_4_ * fVar206;
  auVar113._12_4_ = auVar119._12_4_ * fVar183;
  auVar113._16_4_ = auVar119._16_4_ * fVar196;
  auVar113._20_4_ = auVar119._20_4_ * fVar104;
  auVar113._24_4_ = auVar119._24_4_ * fVar105;
  auVar113._28_4_ = auVar112._28_4_;
  auVar23 = vfmadd231ps_fma(auVar121,auVar120,auVar114);
  auVar108 = vfmadd231ps_fma(auVar127,auVar120,auVar128);
  auVar107 = vfmadd231ps_fma(auVar113,auVar118,auVar120);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar225,auVar116);
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar225,auVar130);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar117,auVar225);
  auVar226._4_4_ = fVar182;
  auVar226._0_4_ = fVar182;
  auVar226._8_4_ = fVar182;
  auVar226._12_4_ = fVar182;
  auVar226._16_4_ = fVar182;
  auVar226._20_4_ = fVar182;
  auVar226._24_4_ = fVar182;
  auVar226._28_4_ = fVar182;
  auVar113 = ZEXT1632(CONCAT412(fVar197 * auVar184._12_4_,
                                CONCAT48(fVar197 * auVar184._8_4_,
                                         CONCAT44(fVar197 * auVar184._4_4_,fVar182))));
  auVar127 = vpermps_avx2(auVar227,auVar113);
  auVar113 = vpermps_avx512vl(auVar111,auVar113);
  fVar197 = auVar113._0_4_;
  fVar163 = auVar113._4_4_;
  auVar120._4_4_ = fVar163 * auVar129._4_4_;
  auVar120._0_4_ = fVar197 * auVar129._0_4_;
  fVar205 = auVar113._8_4_;
  auVar120._8_4_ = fVar205 * auVar129._8_4_;
  fVar206 = auVar113._12_4_;
  auVar120._12_4_ = fVar206 * auVar129._12_4_;
  fVar183 = auVar113._16_4_;
  auVar120._16_4_ = fVar183 * auVar129._16_4_;
  fVar196 = auVar113._20_4_;
  auVar120._20_4_ = fVar196 * auVar129._20_4_;
  fVar104 = auVar113._24_4_;
  auVar120._24_4_ = fVar104 * auVar129._24_4_;
  auVar120._28_4_ = 1;
  auVar111._4_4_ = auVar115._4_4_ * fVar163;
  auVar111._0_4_ = auVar115._0_4_ * fVar197;
  auVar111._8_4_ = auVar115._8_4_ * fVar205;
  auVar111._12_4_ = auVar115._12_4_ * fVar206;
  auVar111._16_4_ = auVar115._16_4_ * fVar183;
  auVar111._20_4_ = auVar115._20_4_ * fVar196;
  auVar111._24_4_ = auVar115._24_4_ * fVar104;
  auVar111._28_4_ = auVar129._28_4_;
  auVar115._4_4_ = auVar119._4_4_ * fVar163;
  auVar115._0_4_ = auVar119._0_4_ * fVar197;
  auVar115._8_4_ = auVar119._8_4_ * fVar205;
  auVar115._12_4_ = auVar119._12_4_ * fVar206;
  auVar115._16_4_ = auVar119._16_4_ * fVar183;
  auVar115._20_4_ = auVar119._20_4_ * fVar196;
  auVar115._24_4_ = auVar119._24_4_ * fVar104;
  auVar115._28_4_ = auVar113._28_4_;
  auVar8 = vfmadd231ps_fma(auVar120,auVar127,auVar114);
  auVar9 = vfmadd231ps_fma(auVar111,auVar127,auVar128);
  auVar166 = vfmadd231ps_fma(auVar115,auVar127,auVar118);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar226,auVar116);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar226,auVar130);
  auVar218._8_4_ = 0x7fffffff;
  auVar218._0_8_ = 0x7fffffff7fffffff;
  auVar218._12_4_ = 0x7fffffff;
  auVar218._16_4_ = 0x7fffffff;
  auVar218._20_4_ = 0x7fffffff;
  auVar218._24_4_ = 0x7fffffff;
  auVar218._28_4_ = 0x7fffffff;
  auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar226,auVar117);
  auVar116 = vandps_avx(ZEXT1632(auVar23),auVar218);
  auVar126._8_4_ = 0x219392ef;
  auVar126._0_8_ = 0x219392ef219392ef;
  auVar126._12_4_ = 0x219392ef;
  auVar126._16_4_ = 0x219392ef;
  auVar126._20_4_ = 0x219392ef;
  auVar126._24_4_ = 0x219392ef;
  auVar126._28_4_ = 0x219392ef;
  uVar101 = vcmpps_avx512vl(auVar116,auVar126,1);
  bVar16 = (bool)((byte)uVar101 & 1);
  auVar112._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._0_4_;
  bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._4_4_;
  bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._8_4_;
  bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar101 >> 7) * 0x219392ef;
  auVar116 = vandps_avx(ZEXT1632(auVar108),auVar218);
  uVar101 = vcmpps_avx512vl(auVar116,auVar126,1);
  bVar16 = (bool)((byte)uVar101 & 1);
  auVar122._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar108._0_4_;
  bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar122._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar108._4_4_;
  bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar122._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar108._8_4_;
  bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar122._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar108._12_4_;
  auVar122._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * 0x219392ef;
  auVar122._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * 0x219392ef;
  auVar122._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * 0x219392ef;
  auVar122._28_4_ = (uint)(byte)(uVar101 >> 7) * 0x219392ef;
  auVar116 = vandps_avx(ZEXT1632(auVar107),auVar218);
  uVar101 = vcmpps_avx512vl(auVar116,auVar126,1);
  bVar16 = (bool)((byte)uVar101 & 1);
  auVar116._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._0_4_;
  bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar116._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._4_4_;
  bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar116._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._8_4_;
  bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar116._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._12_4_;
  auVar116._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * 0x219392ef;
  auVar116._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * 0x219392ef;
  auVar116._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * 0x219392ef;
  auVar116._28_4_ = (uint)(byte)(uVar101 >> 7) * 0x219392ef;
  auVar114 = vrcp14ps_avx512vl(auVar112);
  auVar215._8_4_ = 0x3f800000;
  auVar215._0_8_ = &DAT_3f8000003f800000;
  auVar215._12_4_ = 0x3f800000;
  auVar215._16_4_ = 0x3f800000;
  auVar215._20_4_ = 0x3f800000;
  auVar215._24_4_ = 0x3f800000;
  auVar215._28_4_ = 0x3f800000;
  auVar23 = vfnmadd213ps_fma(auVar112,auVar114,auVar215);
  auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar114,auVar114);
  auVar114 = vrcp14ps_avx512vl(auVar122);
  auVar108 = vfnmadd213ps_fma(auVar122,auVar114,auVar215);
  auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar114,auVar114);
  auVar114 = vrcp14ps_avx512vl(auVar116);
  auVar107 = vfnmadd213ps_fma(auVar116,auVar114,auVar215);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar114,auVar114);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 7 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar8));
  auVar117._4_4_ = auVar23._4_4_ * auVar116._4_4_;
  auVar117._0_4_ = auVar23._0_4_ * auVar116._0_4_;
  auVar117._8_4_ = auVar23._8_4_ * auVar116._8_4_;
  auVar117._12_4_ = auVar23._12_4_ * auVar116._12_4_;
  auVar117._16_4_ = auVar116._16_4_ * 0.0;
  auVar117._20_4_ = auVar116._20_4_ * 0.0;
  auVar117._24_4_ = auVar116._24_4_ * 0.0;
  auVar117._28_4_ = auVar116._28_4_;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 9 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar8));
  auVar115 = vpbroadcastd_avx512vl();
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar125._0_4_ = auVar23._0_4_ * auVar116._0_4_;
  auVar125._4_4_ = auVar23._4_4_ * auVar116._4_4_;
  auVar125._8_4_ = auVar23._8_4_ * auVar116._8_4_;
  auVar125._12_4_ = auVar23._12_4_ * auVar116._12_4_;
  auVar125._16_4_ = auVar116._16_4_ * 0.0;
  auVar125._20_4_ = auVar116._20_4_ * 0.0;
  auVar125._24_4_ = auVar116._24_4_ * 0.0;
  auVar125._28_4_ = 0;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar97 * -2 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar9));
  auVar118._4_4_ = auVar108._4_4_ * auVar116._4_4_;
  auVar118._0_4_ = auVar108._0_4_ * auVar116._0_4_;
  auVar118._8_4_ = auVar108._8_4_ * auVar116._8_4_;
  auVar118._12_4_ = auVar108._12_4_ * auVar116._12_4_;
  auVar118._16_4_ = auVar116._16_4_ * 0.0;
  auVar118._20_4_ = auVar116._20_4_ * 0.0;
  auVar118._24_4_ = auVar116._24_4_ * 0.0;
  auVar118._28_4_ = auVar116._28_4_;
  auVar216 = ZEXT3264(auVar118);
  auVar116 = vcvtdq2ps_avx(auVar114);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar9));
  auVar124._0_4_ = auVar108._0_4_ * auVar116._0_4_;
  auVar124._4_4_ = auVar108._4_4_ * auVar116._4_4_;
  auVar124._8_4_ = auVar108._8_4_ * auVar116._8_4_;
  auVar124._12_4_ = auVar108._12_4_ * auVar116._12_4_;
  auVar124._16_4_ = auVar116._16_4_ * 0.0;
  auVar124._20_4_ = auVar116._20_4_ * 0.0;
  auVar124._24_4_ = auVar116._24_4_ * 0.0;
  auVar124._28_4_ = 0;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 + uVar97 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar166));
  auVar119._4_4_ = auVar116._4_4_ * auVar107._4_4_;
  auVar119._0_4_ = auVar116._0_4_ * auVar107._0_4_;
  auVar119._8_4_ = auVar116._8_4_ * auVar107._8_4_;
  auVar119._12_4_ = auVar116._12_4_ * auVar107._12_4_;
  auVar119._16_4_ = auVar116._16_4_ * 0.0;
  auVar119._20_4_ = auVar116._20_4_ * 0.0;
  auVar119._24_4_ = auVar116._24_4_ * 0.0;
  auVar119._28_4_ = auVar116._28_4_;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x17 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar166));
  auVar123._0_4_ = auVar107._0_4_ * auVar116._0_4_;
  auVar123._4_4_ = auVar107._4_4_ * auVar116._4_4_;
  auVar123._8_4_ = auVar107._8_4_ * auVar116._8_4_;
  auVar123._12_4_ = auVar107._12_4_ * auVar116._12_4_;
  auVar123._16_4_ = auVar116._16_4_ * 0.0;
  auVar123._20_4_ = auVar116._20_4_ * 0.0;
  auVar123._24_4_ = auVar116._24_4_ * 0.0;
  auVar123._28_4_ = 0;
  auVar116 = vpminsd_avx2(auVar117,auVar125);
  auVar114 = vpminsd_avx2(auVar118,auVar124);
  auVar116 = vmaxps_avx(auVar116,auVar114);
  auVar114 = vpminsd_avx2(auVar119,auVar123);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar129._4_4_ = uVar164;
  auVar129._0_4_ = uVar164;
  auVar129._8_4_ = uVar164;
  auVar129._12_4_ = uVar164;
  auVar129._16_4_ = uVar164;
  auVar129._20_4_ = uVar164;
  auVar129._24_4_ = uVar164;
  auVar129._28_4_ = uVar164;
  auVar114 = vmaxps_avx512vl(auVar114,auVar129);
  auVar116 = vmaxps_avx(auVar116,auVar114);
  auVar114._8_4_ = 0x3f7ffffa;
  auVar114._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar114._12_4_ = 0x3f7ffffa;
  auVar114._16_4_ = 0x3f7ffffa;
  auVar114._20_4_ = 0x3f7ffffa;
  auVar114._24_4_ = 0x3f7ffffa;
  auVar114._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar116,auVar114);
  auVar195 = ZEXT3264(local_80);
  auVar116 = vpmaxsd_avx2(auVar117,auVar125);
  auVar114 = vpmaxsd_avx2(auVar118,auVar124);
  auVar116 = vminps_avx(auVar116,auVar114);
  auVar114 = vpmaxsd_avx2(auVar119,auVar123);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar130._4_4_ = uVar164;
  auVar130._0_4_ = uVar164;
  auVar130._8_4_ = uVar164;
  auVar130._12_4_ = uVar164;
  auVar130._16_4_ = uVar164;
  auVar130._20_4_ = uVar164;
  auVar130._24_4_ = uVar164;
  auVar130._28_4_ = uVar164;
  auVar114 = vminps_avx512vl(auVar114,auVar130);
  auVar116 = vminps_avx(auVar116,auVar114);
  auVar128._8_4_ = 0x3f800003;
  auVar128._0_8_ = 0x3f8000033f800003;
  auVar128._12_4_ = 0x3f800003;
  auVar128._16_4_ = 0x3f800003;
  auVar128._20_4_ = 0x3f800003;
  auVar128._24_4_ = 0x3f800003;
  auVar128._28_4_ = 0x3f800003;
  auVar116 = vmulps_avx512vl(auVar116,auVar128);
  uVar26 = vpcmpgtd_avx512vl(auVar115,_DAT_0205a920);
  uVar24 = vcmpps_avx512vl(local_80,auVar116,2);
  if ((byte)((byte)uVar24 & (byte)uVar26) != 0) {
    uVar101 = (ulong)(byte)((byte)uVar24 & (byte)uVar26);
    local_5c8 = pre->ray_space + k;
    local_6c8 = (undefined1 (*) [32])&local_200;
    local_320 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar114 = auVar216._0_32_;
      auVar116 = auVar195._0_32_;
      local_660 = in_ZMM21._0_32_;
      local_640 = in_ZMM20._0_32_;
      lVar27 = 0;
      for (uVar94 = uVar101; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar100 = *(uint *)(prim + 2);
      uVar12 = *(uint *)(prim + lVar27 * 4 + 6);
      pGVar99 = (context->scene->geometries).items[uVar100].ptr;
      uVar94 = (ulong)*(uint *)(*(long *)&pGVar99->field_0x58 +
                               pGVar99[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar12);
      p_Var15 = pGVar99[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar99[1].time_range.upper;
      auVar23 = *(undefined1 (*) [16])(lVar27 + (long)p_Var15 * uVar94);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar94 + 1) * (long)p_Var15);
      uVar24 = *(undefined8 *)*pauVar3;
      uVar26 = *(undefined8 *)(*pauVar3 + 8);
      auVar9 = *pauVar3;
      auVar108 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar94 + 2) * (long)p_Var15);
      uVar81 = *(undefined8 *)*pauVar4;
      uVar82 = *(undefined8 *)(*pauVar4 + 8);
      auVar8 = *pauVar4;
      auVar107 = *pauVar4;
      uVar101 = uVar101 - 1 & uVar101;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar94 + 3) * (long)p_Var15);
      local_440 = *(undefined8 *)*pauVar5;
      uStack_438 = *(undefined8 *)(*pauVar5 + 8);
      local_6e0 = (float)local_440;
      fStack_6dc = (float)((ulong)local_440 >> 0x20);
      fStack_6d8 = (float)uStack_438;
      fStack_6d4 = (float)((ulong)uStack_438 >> 0x20);
      if (uVar101 != 0) {
        uVar97 = uVar101 - 1 & uVar101;
        for (uVar94 = uVar101; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
        }
        if (uVar97 != 0) {
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar99[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar166 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar106 = vsubps_avx(auVar23,auVar166);
      uVar164 = auVar106._0_4_;
      auVar179._4_4_ = uVar164;
      auVar179._0_4_ = uVar164;
      auVar179._8_4_ = uVar164;
      auVar179._12_4_ = uVar164;
      auVar165 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      aVar6 = (local_5c8->vx).field_0;
      aVar7 = (local_5c8->vy).field_0;
      fVar197 = (local_5c8->vz).field_0.m128[0];
      fVar163 = *(float *)((long)&(local_5c8->vz).field_0 + 4);
      fVar205 = *(float *)((long)&(local_5c8->vz).field_0 + 8);
      fVar206 = *(float *)((long)&(local_5c8->vz).field_0 + 0xc);
      auVar220._0_4_ = fVar197 * auVar106._0_4_;
      auVar220._4_4_ = fVar163 * auVar106._4_4_;
      auVar220._8_4_ = fVar205 * auVar106._8_4_;
      auVar220._12_4_ = fVar206 * auVar106._12_4_;
      auVar165 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar7,auVar165);
      auVar179 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar6,auVar179);
      auVar165 = vshufps_avx(auVar23,auVar23,0xff);
      auVar10 = vsubps_avx(auVar108,auVar166);
      uVar164 = auVar10._0_4_;
      auVar184._4_4_ = uVar164;
      auVar184._0_4_ = uVar164;
      auVar184._8_4_ = uVar164;
      auVar184._12_4_ = uVar164;
      auVar106 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar221._0_4_ = fVar197 * auVar10._0_4_;
      auVar221._4_4_ = fVar163 * auVar10._4_4_;
      auVar221._8_4_ = fVar205 * auVar10._8_4_;
      auVar221._12_4_ = fVar206 * auVar10._12_4_;
      auVar106 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar7,auVar106);
      auVar184 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar6,auVar184);
      auVar108 = vshufps_avx(auVar108,auVar108,0xff);
      auVar10 = vsubps_avx(auVar107,auVar166);
      uVar164 = auVar10._0_4_;
      auVar217._4_4_ = uVar164;
      auVar217._0_4_ = uVar164;
      auVar217._8_4_ = uVar164;
      auVar217._12_4_ = uVar164;
      auVar106 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar110._0_4_ = fVar197 * auVar10._0_4_;
      auVar110._4_4_ = fVar163 * auVar10._4_4_;
      auVar110._8_4_ = fVar205 * auVar10._8_4_;
      auVar110._12_4_ = fVar206 * auVar10._12_4_;
      auVar106 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar7,auVar106);
      auVar10 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar6,auVar217);
      auVar107 = vshufps_avx(auVar107,auVar107,0xff);
      auVar28._12_4_ = fStack_6d4;
      auVar28._0_12_ = *pauVar5;
      auVar106 = vsubps_avx512vl(auVar28,auVar166);
      uVar164 = auVar106._0_4_;
      auVar109._4_4_ = uVar164;
      auVar109._0_4_ = uVar164;
      auVar109._8_4_ = uVar164;
      auVar109._12_4_ = uVar164;
      auVar166 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar223._0_4_ = fVar197 * auVar106._0_4_;
      auVar223._4_4_ = fVar163 * auVar106._4_4_;
      auVar223._8_4_ = fVar205 * auVar106._8_4_;
      auVar223._12_4_ = fVar206 * auVar106._12_4_;
      auVar166 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar7,auVar166);
      auVar166 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar6,auVar109);
      lVar27 = (long)iVar13 * 0x44;
      auVar129 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27);
      auVar106 = vshufps_avx512vl(auVar28,auVar28,0xff);
      local_580 = vbroadcastss_avx512vl(auVar179);
      auVar198._8_4_ = 1;
      auVar198._0_8_ = 0x100000001;
      auVar198._12_4_ = 1;
      auVar198._16_4_ = 1;
      auVar198._20_4_ = 1;
      auVar198._24_4_ = 1;
      auVar198._28_4_ = 1;
      local_5a0 = vpermps_avx512vl(auVar198,ZEXT1632(auVar179));
      uVar176 = auVar165._0_8_;
      local_a0._8_8_ = uVar176;
      local_a0._0_8_ = uVar176;
      local_a0._16_8_ = uVar176;
      local_a0._24_8_ = uVar176;
      auVar130 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x484);
      uVar164 = auVar184._0_4_;
      local_6c0._4_4_ = uVar164;
      local_6c0._0_4_ = uVar164;
      local_6c0._8_4_ = uVar164;
      local_6c0._12_4_ = uVar164;
      local_6c0._16_4_ = uVar164;
      local_6c0._20_4_ = uVar164;
      local_6c0._24_4_ = uVar164;
      local_6c0._28_4_ = uVar164;
      local_300 = vpermps_avx512vl(auVar198,ZEXT1632(auVar184));
      uVar176 = auVar108._0_8_;
      local_c0._8_8_ = uVar176;
      local_c0._0_8_ = uVar176;
      local_c0._16_8_ = uVar176;
      local_c0._24_8_ = uVar176;
      auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar10);
      local_100 = vpermps_avx512vl(auVar198,ZEXT1632(auVar10));
      local_120 = vbroadcastsd_avx512vl(auVar107);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0xd8c);
      local_680 = vbroadcastss_avx512vl(auVar166);
      auVar235 = ZEXT3264(local_680);
      local_6a0 = vpermps_avx512vl(auVar198,ZEXT1632(auVar166));
      auVar236 = ZEXT3264(local_6a0);
      _local_140 = vbroadcastsd_avx512vl(auVar106);
      auVar117 = vmulps_avx512vl(local_680,auVar115);
      auVar118 = vmulps_avx512vl(local_6a0,auVar115);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar128,local_e0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar128,local_100);
      auVar108 = vfmadd231ps_fma(auVar117,auVar130,local_6c0);
      auVar119 = vfmadd231ps_avx512vl(auVar118,auVar130,local_300);
      auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),auVar129,local_580);
      auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27);
      auVar118 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x484);
      auVar120 = vfmadd231ps_avx512vl(auVar119,auVar129,local_5a0);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x908);
      auVar127 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0xd8c);
      auVar121 = vmulps_avx512vl(local_680,auVar127);
      auVar111 = vmulps_avx512vl(local_6a0,auVar127);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar119,local_e0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,local_100);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,local_6c0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_300);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,local_580);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,local_5a0);
      auVar112 = vsubps_avx512vl(auVar121,auVar113);
      auVar122 = vsubps_avx512vl(auVar111,auVar120);
      auVar123 = vmulps_avx512vl(auVar120,auVar112);
      auVar124 = vmulps_avx512vl(auVar113,auVar122);
      auVar123 = vsubps_avx512vl(auVar123,auVar124);
      auVar124 = vmulps_avx512vl(_local_140,auVar115);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar128,local_120);
      auVar108 = vfmadd231ps_fma(auVar124,auVar130,local_c0);
      auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),auVar129,local_a0);
      auVar125 = vmulps_avx512vl(_local_140,auVar127);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar119,local_120);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar118,local_c0);
      auVar165 = vfmadd231ps_fma(auVar125,auVar117,local_a0);
      auVar125 = vmulps_avx512vl(auVar122,auVar122);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar112,auVar112);
      auVar126 = vmaxps_avx512vl(auVar124,ZEXT1632(auVar165));
      auVar126 = vmulps_avx512vl(auVar126,auVar126);
      auVar125 = vmulps_avx512vl(auVar126,auVar125);
      auVar123 = vmulps_avx512vl(auVar123,auVar123);
      uVar176 = vcmpps_avx512vl(auVar123,auVar125,2);
      auVar108 = vblendps_avx(auVar179,auVar23,8);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar107 = vandps_avx512vl(auVar108,auVar106);
      auVar108 = vblendps_avx(auVar184,*pauVar3,8);
      auVar108 = vandps_avx512vl(auVar108,auVar106);
      auVar107 = vmaxps_avx(auVar107,auVar108);
      auVar108 = vblendps_avx(auVar10,*pauVar4,8);
      auVar109 = vandps_avx512vl(auVar108,auVar106);
      auVar108 = vblendps_avx(auVar166,auVar28,8);
      auVar108 = vandps_avx512vl(auVar108,auVar106);
      auVar108 = vmaxps_avx(auVar109,auVar108);
      auVar108 = vmaxps_avx(auVar107,auVar108);
      auVar107 = vmovshdup_avx(auVar108);
      auVar107 = vmaxss_avx(auVar107,auVar108);
      auVar108 = vshufpd_avx(auVar108,auVar108,1);
      auVar108 = vmaxss_avx(auVar108,auVar107);
      auVar224._0_4_ = (float)iVar13;
      _auStack_4fc = auVar179._4_12_;
      auVar224._4_4_ = auVar224._0_4_;
      auVar224._8_4_ = auVar224._0_4_;
      auVar224._12_4_ = auVar224._0_4_;
      auVar224._16_4_ = auVar224._0_4_;
      auVar224._20_4_ = auVar224._0_4_;
      auVar224._24_4_ = auVar224._0_4_;
      auVar224._28_4_ = auVar224._0_4_;
      uVar25 = vcmpps_avx512vl(auVar224,_DAT_02020f40,0xe);
      bVar103 = (byte)uVar176 & (byte)uVar25;
      auVar108 = vmulss_avx512f(auVar108,ZEXT416(0x35000000));
      auVar193._8_4_ = 2;
      auVar193._0_8_ = 0x200000002;
      auVar193._12_4_ = 2;
      auVar193._16_4_ = 2;
      auVar193._20_4_ = 2;
      auVar193._24_4_ = 2;
      auVar193._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar193,ZEXT1632(auVar179));
      local_180 = vpermps_avx512vl(auVar193,ZEXT1632(auVar184));
      local_1a0 = vpermps_avx512vl(auVar193,ZEXT1632(auVar10));
      local_1c0 = vpermps_avx2(auVar193,ZEXT1632(auVar166));
      uVar98 = *(uint *)(ray + k * 4 + 0x60);
      auVar107 = local_300._0_16_;
      local_500 = auVar224._0_4_;
      if (bVar103 == 0) {
        auVar107 = vxorps_avx512vl(auVar107,auVar107);
        auVar234 = ZEXT1664(auVar107);
        auVar216 = ZEXT3264(auVar114);
        in_ZMM20 = ZEXT3264(local_640);
        auVar195 = ZEXT3264(auVar116);
        in_ZMM21 = ZEXT3264(local_660);
        auVar232 = ZEXT3264(local_580);
        auVar231 = ZEXT3264(local_5a0);
        auVar230 = ZEXT3264(local_6c0);
      }
      else {
        local_5c0._0_16_ = ZEXT416(uVar98);
        local_560._0_16_ = auVar108;
        auVar127 = vmulps_avx512vl(local_1c0,auVar127);
        auVar119 = vfmadd213ps_avx512vl(auVar119,local_1a0,auVar127);
        auVar118 = vfmadd213ps_avx512vl(auVar118,local_180,auVar119);
        auVar118 = vfmadd213ps_avx512vl(auVar117,local_160,auVar118);
        auVar115 = vmulps_avx512vl(local_1c0,auVar115);
        auVar128 = vfmadd213ps_avx512vl(auVar128,local_1a0,auVar115);
        auVar119 = vfmadd213ps_avx512vl(auVar130,local_180,auVar128);
        auVar130 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1210);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1694);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1b18);
        auVar117 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1f9c);
        auVar119 = vfmadd213ps_avx512vl(auVar129,local_160,auVar119);
        auVar129 = vmulps_avx512vl(local_680,auVar117);
        auVar127 = vmulps_avx512vl(local_6a0,auVar117);
        auVar117 = vmulps_avx512vl(local_1c0,auVar117);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar115,local_e0);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar115,local_100);
        auVar115 = vfmadd231ps_avx512vl(auVar117,local_1a0,auVar115);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar128,local_6c0);
        auVar117 = vfmadd231ps_avx512vl(auVar127,auVar128,local_300);
        auVar127 = vfmadd231ps_avx512vl(auVar115,local_180,auVar128);
        auVar123 = vfmadd231ps_avx512vl(auVar129,auVar130,local_580);
        auVar231 = ZEXT3264(local_5a0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar130,local_5a0);
        auVar129 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1210);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1f9c);
        auVar127 = vfmadd231ps_avx512vl(auVar127,local_160,auVar130);
        auVar130 = vmulps_avx512vl(local_680,auVar115);
        auVar125 = vmulps_avx512vl(local_6a0,auVar115);
        auVar115 = vmulps_avx512vl(local_1c0,auVar115);
        auVar233 = ZEXT1664(auVar108);
        auVar126 = vfmadd231ps_avx512vl(auVar130,auVar128,local_e0);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar128,local_100);
        auVar128 = vfmadd231ps_avx512vl(auVar115,local_1a0,auVar128);
        auVar130 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1694);
        auVar115 = vfmadd231ps_avx512vl(auVar126,auVar130,local_6c0);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar130,local_300);
        auVar130 = vfmadd231ps_avx512vl(auVar128,local_180,auVar130);
        auVar128 = vfmadd231ps_avx512vl(auVar115,auVar129,local_580);
        auVar115 = vfmadd231ps_avx512vl(auVar125,auVar129,local_5a0);
        auVar125 = vfmadd231ps_avx512vl(auVar130,local_160,auVar129);
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar129 = vandps_avx(auVar123,auVar228);
        auVar130 = vandps_avx(auVar117,auVar228);
        auVar130 = vmaxps_avx(auVar129,auVar130);
        auVar129 = vandps_avx(auVar127,auVar228);
        auVar129 = vmaxps_avx(auVar130,auVar129);
        auVar127 = vbroadcastss_avx512vl(auVar108);
        uVar94 = vcmpps_avx512vl(auVar129,auVar127,1);
        bVar16 = (bool)((byte)uVar94 & 1);
        auVar131._0_4_ = (float)((uint)bVar16 * auVar112._0_4_ | (uint)!bVar16 * auVar123._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar123._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar123._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar123._12_4_);
        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * auVar123._16_4_);
        bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * auVar123._20_4_);
        bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * auVar123._24_4_);
        bVar16 = SUB81(uVar94 >> 7,0);
        auVar131._28_4_ = (uint)bVar16 * auVar112._28_4_ | (uint)!bVar16 * auVar123._28_4_;
        bVar16 = (bool)((byte)uVar94 & 1);
        auVar132._0_4_ = (float)((uint)bVar16 * auVar122._0_4_ | (uint)!bVar16 * auVar117._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar16 * auVar122._4_4_ | (uint)!bVar16 * auVar117._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar16 * auVar122._8_4_ | (uint)!bVar16 * auVar117._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar16 * auVar122._12_4_ | (uint)!bVar16 * auVar117._12_4_);
        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar132._16_4_ = (float)((uint)bVar16 * auVar122._16_4_ | (uint)!bVar16 * auVar117._16_4_);
        bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar132._20_4_ = (float)((uint)bVar16 * auVar122._20_4_ | (uint)!bVar16 * auVar117._20_4_);
        bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar132._24_4_ = (float)((uint)bVar16 * auVar122._24_4_ | (uint)!bVar16 * auVar117._24_4_);
        bVar16 = SUB81(uVar94 >> 7,0);
        auVar132._28_4_ = (uint)bVar16 * auVar122._28_4_ | (uint)!bVar16 * auVar117._28_4_;
        auVar129 = vandps_avx(auVar228,auVar128);
        auVar130 = vandps_avx(auVar115,auVar228);
        auVar130 = vmaxps_avx(auVar129,auVar130);
        auVar129 = vandps_avx(auVar125,auVar228);
        auVar129 = vmaxps_avx(auVar130,auVar129);
        uVar94 = vcmpps_avx512vl(auVar129,auVar127,1);
        bVar16 = (bool)((byte)uVar94 & 1);
        auVar133._0_4_ = (float)((uint)bVar16 * auVar112._0_4_ | (uint)!bVar16 * auVar128._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar128._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar128._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar128._12_4_);
        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar133._16_4_ = (float)((uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * auVar128._16_4_);
        bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar133._20_4_ = (float)((uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * auVar128._20_4_);
        bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar133._24_4_ = (float)((uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * auVar128._24_4_);
        bVar16 = SUB81(uVar94 >> 7,0);
        auVar133._28_4_ = (uint)bVar16 * auVar112._28_4_ | (uint)!bVar16 * auVar128._28_4_;
        bVar16 = (bool)((byte)uVar94 & 1);
        auVar134._0_4_ = (float)((uint)bVar16 * auVar122._0_4_ | (uint)!bVar16 * auVar115._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar16 * auVar122._4_4_ | (uint)!bVar16 * auVar115._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar16 * auVar122._8_4_ | (uint)!bVar16 * auVar115._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar16 * auVar122._12_4_ | (uint)!bVar16 * auVar115._12_4_);
        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar16 * auVar122._16_4_ | (uint)!bVar16 * auVar115._16_4_);
        bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar16 * auVar122._20_4_ | (uint)!bVar16 * auVar115._20_4_);
        bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar16 * auVar122._24_4_ | (uint)!bVar16 * auVar115._24_4_);
        bVar16 = SUB81(uVar94 >> 7,0);
        auVar134._28_4_ = (uint)bVar16 * auVar122._28_4_ | (uint)!bVar16 * auVar115._28_4_;
        auVar110 = vxorps_avx512vl(auVar107,auVar107);
        auVar234 = ZEXT1664(auVar110);
        auVar129 = vfmadd213ps_avx512vl(auVar131,auVar131,ZEXT1632(auVar110));
        auVar107 = vfmadd231ps_fma(auVar129,auVar132,auVar132);
        auVar129 = vrsqrt14ps_avx512vl(ZEXT1632(auVar107));
        fVar197 = auVar129._0_4_;
        fVar163 = auVar129._4_4_;
        fVar205 = auVar129._8_4_;
        fVar206 = auVar129._12_4_;
        fVar183 = auVar129._16_4_;
        fVar196 = auVar129._20_4_;
        fVar104 = auVar129._24_4_;
        auVar40._4_4_ = fVar163 * fVar163 * fVar163 * auVar107._4_4_ * -0.5;
        auVar40._0_4_ = fVar197 * fVar197 * fVar197 * auVar107._0_4_ * -0.5;
        auVar40._8_4_ = fVar205 * fVar205 * fVar205 * auVar107._8_4_ * -0.5;
        auVar40._12_4_ = fVar206 * fVar206 * fVar206 * auVar107._12_4_ * -0.5;
        auVar40._16_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar40._20_4_ = fVar196 * fVar196 * fVar196 * -0.0;
        auVar40._24_4_ = fVar104 * fVar104 * fVar104 * -0.0;
        auVar40._28_4_ = 0;
        auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar128 = vfmadd231ps_avx512vl(auVar40,auVar130,auVar129);
        auVar41._4_4_ = auVar132._4_4_ * auVar128._4_4_;
        auVar41._0_4_ = auVar132._0_4_ * auVar128._0_4_;
        auVar41._8_4_ = auVar132._8_4_ * auVar128._8_4_;
        auVar41._12_4_ = auVar132._12_4_ * auVar128._12_4_;
        auVar41._16_4_ = auVar132._16_4_ * auVar128._16_4_;
        auVar41._20_4_ = auVar132._20_4_ * auVar128._20_4_;
        auVar41._24_4_ = auVar132._24_4_ * auVar128._24_4_;
        auVar41._28_4_ = auVar129._28_4_;
        auVar42._4_4_ = auVar128._4_4_ * -auVar131._4_4_;
        auVar42._0_4_ = auVar128._0_4_ * -auVar131._0_4_;
        auVar42._8_4_ = auVar128._8_4_ * -auVar131._8_4_;
        auVar42._12_4_ = auVar128._12_4_ * -auVar131._12_4_;
        auVar42._16_4_ = auVar128._16_4_ * -auVar131._16_4_;
        auVar42._20_4_ = auVar128._20_4_ * -auVar131._20_4_;
        auVar42._24_4_ = auVar128._24_4_ * -auVar131._24_4_;
        auVar42._28_4_ = auVar131._28_4_ ^ 0x80000000;
        auVar129 = vmulps_avx512vl(auVar128,ZEXT1632(auVar110));
        auVar112 = ZEXT1632(auVar110);
        auVar115 = vfmadd213ps_avx512vl(auVar133,auVar133,auVar112);
        auVar107 = vfmadd231ps_fma(auVar115,auVar134,auVar134);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar107));
        fVar197 = auVar115._0_4_;
        fVar163 = auVar115._4_4_;
        fVar205 = auVar115._8_4_;
        fVar206 = auVar115._12_4_;
        fVar183 = auVar115._16_4_;
        fVar196 = auVar115._20_4_;
        fVar104 = auVar115._24_4_;
        auVar43._4_4_ = fVar163 * fVar163 * fVar163 * auVar107._4_4_ * -0.5;
        auVar43._0_4_ = fVar197 * fVar197 * fVar197 * auVar107._0_4_ * -0.5;
        auVar43._8_4_ = fVar205 * fVar205 * fVar205 * auVar107._8_4_ * -0.5;
        auVar43._12_4_ = fVar206 * fVar206 * fVar206 * auVar107._12_4_ * -0.5;
        auVar43._16_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar43._20_4_ = fVar196 * fVar196 * fVar196 * -0.0;
        auVar43._24_4_ = fVar104 * fVar104 * fVar104 * -0.0;
        auVar43._28_4_ = 0;
        auVar130 = vfmadd231ps_avx512vl(auVar43,auVar130,auVar115);
        auVar44._4_4_ = auVar134._4_4_ * auVar130._4_4_;
        auVar44._0_4_ = auVar134._0_4_ * auVar130._0_4_;
        auVar44._8_4_ = auVar134._8_4_ * auVar130._8_4_;
        auVar44._12_4_ = auVar134._12_4_ * auVar130._12_4_;
        auVar44._16_4_ = auVar134._16_4_ * auVar130._16_4_;
        auVar44._20_4_ = auVar134._20_4_ * auVar130._20_4_;
        auVar44._24_4_ = auVar134._24_4_ * auVar130._24_4_;
        auVar44._28_4_ = auVar115._28_4_;
        auVar45._4_4_ = -auVar133._4_4_ * auVar130._4_4_;
        auVar45._0_4_ = -auVar133._0_4_ * auVar130._0_4_;
        auVar45._8_4_ = -auVar133._8_4_ * auVar130._8_4_;
        auVar45._12_4_ = -auVar133._12_4_ * auVar130._12_4_;
        auVar45._16_4_ = -auVar133._16_4_ * auVar130._16_4_;
        auVar45._20_4_ = -auVar133._20_4_ * auVar130._20_4_;
        auVar45._24_4_ = -auVar133._24_4_ * auVar130._24_4_;
        auVar45._28_4_ = auVar128._28_4_;
        auVar130 = vmulps_avx512vl(auVar130,auVar112);
        auVar107 = vfmadd213ps_fma(auVar41,auVar124,auVar113);
        auVar166 = vfmadd213ps_fma(auVar42,auVar124,auVar120);
        auVar128 = vfmadd213ps_avx512vl(auVar129,auVar124,auVar119);
        auVar115 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar165),auVar121);
        auVar28 = vfnmadd213ps_fma(auVar41,auVar124,auVar113);
        auVar127 = ZEXT1632(auVar165);
        auVar106 = vfmadd213ps_fma(auVar45,auVar127,auVar111);
        auVar109 = vfnmadd213ps_fma(auVar42,auVar124,auVar120);
        auVar10 = vfmadd213ps_fma(auVar130,auVar127,auVar118);
        auVar117 = vfnmadd231ps_avx512vl(auVar119,auVar124,auVar129);
        auVar217 = vfnmadd213ps_fma(auVar44,auVar127,auVar121);
        auVar220 = vfnmadd213ps_fma(auVar45,auVar127,auVar111);
        auVar221 = vfnmadd231ps_fma(auVar118,ZEXT1632(auVar165),auVar130);
        auVar130 = vsubps_avx512vl(auVar115,ZEXT1632(auVar28));
        auVar129 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar109));
        auVar118 = vsubps_avx512vl(ZEXT1632(auVar10),auVar117);
        auVar119 = vmulps_avx512vl(auVar129,auVar117);
        auVar179 = vfmsub231ps_fma(auVar119,ZEXT1632(auVar109),auVar118);
        auVar46._4_4_ = auVar28._4_4_ * auVar118._4_4_;
        auVar46._0_4_ = auVar28._0_4_ * auVar118._0_4_;
        auVar46._8_4_ = auVar28._8_4_ * auVar118._8_4_;
        auVar46._12_4_ = auVar28._12_4_ * auVar118._12_4_;
        auVar46._16_4_ = auVar118._16_4_ * 0.0;
        auVar46._20_4_ = auVar118._20_4_ * 0.0;
        auVar46._24_4_ = auVar118._24_4_ * 0.0;
        auVar46._28_4_ = auVar118._28_4_;
        auVar118 = vfmsub231ps_avx512vl(auVar46,auVar117,auVar130);
        auVar47._4_4_ = auVar109._4_4_ * auVar130._4_4_;
        auVar47._0_4_ = auVar109._0_4_ * auVar130._0_4_;
        auVar47._8_4_ = auVar109._8_4_ * auVar130._8_4_;
        auVar47._12_4_ = auVar109._12_4_ * auVar130._12_4_;
        auVar47._16_4_ = auVar130._16_4_ * 0.0;
        auVar47._20_4_ = auVar130._20_4_ * 0.0;
        auVar47._24_4_ = auVar130._24_4_ * 0.0;
        auVar47._28_4_ = auVar130._28_4_;
        auVar184 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar28),auVar129);
        auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar112,auVar118);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar112,ZEXT1632(auVar179));
        auVar111 = ZEXT1632(auVar110);
        uVar94 = vcmpps_avx512vl(auVar129,auVar111,2);
        bVar93 = (byte)uVar94;
        fVar104 = (float)((uint)(bVar93 & 1) * auVar107._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * auVar217._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        fVar182 = (float)((uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar217._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        fVar156 = (float)((uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar217._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        fVar159 = (float)((uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar217._12_4_);
        auVar119 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar156,CONCAT44(fVar182,fVar104))));
        fVar105 = (float)((uint)(bVar93 & 1) * auVar166._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * auVar220._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        fVar155 = (float)((uint)bVar16 * auVar166._4_4_ | (uint)!bVar16 * auVar220._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        fVar157 = (float)((uint)bVar16 * auVar166._8_4_ | (uint)!bVar16 * auVar220._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        fVar160 = (float)((uint)bVar16 * auVar166._12_4_ | (uint)!bVar16 * auVar220._12_4_);
        auVar127 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar157,CONCAT44(fVar155,fVar105))));
        auVar135._0_4_ =
             (float)((uint)(bVar93 & 1) * auVar128._0_4_ |
                    (uint)!(bool)(bVar93 & 1) * auVar221._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar16 * auVar128._4_4_ | (uint)!bVar16 * auVar221._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar16 * auVar128._8_4_ | (uint)!bVar16 * auVar221._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar16 * auVar128._12_4_ | (uint)!bVar16 * auVar221._12_4_);
        fVar197 = (float)((uint)((byte)(uVar94 >> 4) & 1) * auVar128._16_4_);
        auVar135._16_4_ = fVar197;
        fVar163 = (float)((uint)((byte)(uVar94 >> 5) & 1) * auVar128._20_4_);
        auVar135._20_4_ = fVar163;
        fVar205 = (float)((uint)((byte)(uVar94 >> 6) & 1) * auVar128._24_4_);
        auVar135._24_4_ = fVar205;
        iVar1 = (uint)(byte)(uVar94 >> 7) * auVar128._28_4_;
        auVar135._28_4_ = iVar1;
        auVar130 = vblendmps_avx512vl(ZEXT1632(auVar28),auVar115);
        auVar136._0_4_ =
             (uint)(bVar93 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar179._0_4_;
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar179._4_4_;
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar179._8_4_;
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar179._12_4_;
        auVar136._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * auVar130._16_4_;
        auVar136._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * auVar130._20_4_;
        auVar136._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * auVar130._24_4_;
        auVar136._28_4_ = (uint)(byte)(uVar94 >> 7) * auVar130._28_4_;
        auVar130 = vblendmps_avx512vl(ZEXT1632(auVar109),ZEXT1632(auVar106));
        auVar137._0_4_ =
             (float)((uint)(bVar93 & 1) * auVar130._0_4_ |
                    (uint)!(bool)(bVar93 & 1) * auVar166._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar166._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar166._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar166._12_4_);
        fVar206 = (float)((uint)((byte)(uVar94 >> 4) & 1) * auVar130._16_4_);
        auVar137._16_4_ = fVar206;
        fVar183 = (float)((uint)((byte)(uVar94 >> 5) & 1) * auVar130._20_4_);
        auVar137._20_4_ = fVar183;
        fVar196 = (float)((uint)((byte)(uVar94 >> 6) & 1) * auVar130._24_4_);
        auVar137._24_4_ = fVar196;
        auVar137._28_4_ = (uint)(byte)(uVar94 >> 7) * auVar130._28_4_;
        auVar130 = vblendmps_avx512vl(auVar117,ZEXT1632(auVar10));
        auVar138._0_4_ =
             (float)((uint)(bVar93 & 1) * auVar130._0_4_ |
                    (uint)!(bool)(bVar93 & 1) * auVar128._0_4_);
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar128._4_4_);
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar128._8_4_);
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar128._12_4_);
        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * auVar128._16_4_);
        bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * auVar128._20_4_);
        bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * auVar128._24_4_);
        bVar16 = SUB81(uVar94 >> 7,0);
        auVar138._28_4_ = (uint)bVar16 * auVar130._28_4_ | (uint)!bVar16 * auVar128._28_4_;
        auVar139._0_4_ =
             (uint)(bVar93 & 1) * (int)auVar28._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar115._0_4_;
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar16 * (int)auVar28._4_4_ | (uint)!bVar16 * auVar115._4_4_;
        bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar16 * (int)auVar28._8_4_ | (uint)!bVar16 * auVar115._8_4_;
        bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar16 * (int)auVar28._12_4_ | (uint)!bVar16 * auVar115._12_4_;
        auVar139._16_4_ = (uint)!(bool)((byte)(uVar94 >> 4) & 1) * auVar115._16_4_;
        auVar139._20_4_ = (uint)!(bool)((byte)(uVar94 >> 5) & 1) * auVar115._20_4_;
        auVar139._24_4_ = (uint)!(bool)((byte)(uVar94 >> 6) & 1) * auVar115._24_4_;
        auVar139._28_4_ = (uint)!SUB81(uVar94 >> 7,0) * auVar115._28_4_;
        bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar94 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar140._0_4_ =
             (uint)(bVar93 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar10._0_4_;
        bVar17 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar10._4_4_;
        bVar17 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar10._8_4_;
        bVar17 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar10._12_4_;
        auVar140._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * auVar117._16_4_;
        auVar140._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * auVar117._20_4_;
        auVar140._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * auVar117._24_4_;
        iVar2 = (uint)(byte)(uVar94 >> 7) * auVar117._28_4_;
        auVar140._28_4_ = iVar2;
        auVar113 = vsubps_avx512vl(auVar139,auVar119);
        auVar130 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar109._12_4_ |
                                                 (uint)!bVar19 * auVar106._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar109._8_4_ |
                                                          (uint)!bVar18 * auVar106._8_4_,
                                                          CONCAT44((uint)bVar16 *
                                                                   (int)auVar109._4_4_ |
                                                                   (uint)!bVar16 * auVar106._4_4_,
                                                                   (uint)(bVar93 & 1) *
                                                                   (int)auVar109._0_4_ |
                                                                   (uint)!(bool)(bVar93 & 1) *
                                                                   auVar106._0_4_)))),auVar127);
        auVar128 = vsubps_avx(auVar140,auVar135);
        auVar115 = vsubps_avx(auVar119,auVar136);
        auVar117 = vsubps_avx(auVar127,auVar137);
        auVar118 = vsubps_avx(auVar135,auVar138);
        auVar48._4_4_ = auVar128._4_4_ * fVar182;
        auVar48._0_4_ = auVar128._0_4_ * fVar104;
        auVar48._8_4_ = auVar128._8_4_ * fVar156;
        auVar48._12_4_ = auVar128._12_4_ * fVar159;
        auVar48._16_4_ = auVar128._16_4_ * 0.0;
        auVar48._20_4_ = auVar128._20_4_ * 0.0;
        auVar48._24_4_ = auVar128._24_4_ * 0.0;
        auVar48._28_4_ = iVar2;
        auVar107 = vfmsub231ps_fma(auVar48,auVar135,auVar113);
        auVar49._4_4_ = fVar155 * auVar113._4_4_;
        auVar49._0_4_ = fVar105 * auVar113._0_4_;
        auVar49._8_4_ = fVar157 * auVar113._8_4_;
        auVar49._12_4_ = fVar160 * auVar113._12_4_;
        auVar49._16_4_ = auVar113._16_4_ * 0.0;
        auVar49._20_4_ = auVar113._20_4_ * 0.0;
        auVar49._24_4_ = auVar113._24_4_ * 0.0;
        auVar49._28_4_ = auVar129._28_4_;
        auVar166 = vfmsub231ps_fma(auVar49,auVar119,auVar130);
        auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar166),auVar111,ZEXT1632(auVar107));
        auVar199._0_4_ = auVar130._0_4_ * auVar135._0_4_;
        auVar199._4_4_ = auVar130._4_4_ * auVar135._4_4_;
        auVar199._8_4_ = auVar130._8_4_ * auVar135._8_4_;
        auVar199._12_4_ = auVar130._12_4_ * auVar135._12_4_;
        auVar199._16_4_ = auVar130._16_4_ * fVar197;
        auVar199._20_4_ = auVar130._20_4_ * fVar163;
        auVar199._24_4_ = auVar130._24_4_ * fVar205;
        auVar199._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar199,auVar127,auVar128);
        auVar120 = vfmadd231ps_avx512vl(auVar129,auVar111,ZEXT1632(auVar107));
        auVar129 = vmulps_avx512vl(auVar118,auVar136);
        auVar129 = vfmsub231ps_avx512vl(auVar129,auVar115,auVar138);
        auVar50._4_4_ = auVar117._4_4_ * auVar138._4_4_;
        auVar50._0_4_ = auVar117._0_4_ * auVar138._0_4_;
        auVar50._8_4_ = auVar117._8_4_ * auVar138._8_4_;
        auVar50._12_4_ = auVar117._12_4_ * auVar138._12_4_;
        auVar50._16_4_ = auVar117._16_4_ * auVar138._16_4_;
        auVar50._20_4_ = auVar117._20_4_ * auVar138._20_4_;
        auVar50._24_4_ = auVar117._24_4_ * auVar138._24_4_;
        auVar50._28_4_ = auVar138._28_4_;
        auVar107 = vfmsub231ps_fma(auVar50,auVar137,auVar118);
        auVar200._0_4_ = auVar137._0_4_ * auVar115._0_4_;
        auVar200._4_4_ = auVar137._4_4_ * auVar115._4_4_;
        auVar200._8_4_ = auVar137._8_4_ * auVar115._8_4_;
        auVar200._12_4_ = auVar137._12_4_ * auVar115._12_4_;
        auVar200._16_4_ = fVar206 * auVar115._16_4_;
        auVar200._20_4_ = fVar183 * auVar115._20_4_;
        auVar200._24_4_ = fVar196 * auVar115._24_4_;
        auVar200._28_4_ = 0;
        auVar166 = vfmsub231ps_fma(auVar200,auVar117,auVar136);
        auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar166),auVar111,auVar129);
        auVar121 = vfmadd231ps_avx512vl(auVar129,auVar111,ZEXT1632(auVar107));
        auVar129 = vmaxps_avx(auVar120,auVar121);
        uVar176 = vcmpps_avx512vl(auVar129,auVar111,2);
        bVar103 = bVar103 & (byte)uVar176;
        in_ZMM20 = ZEXT3264(local_640);
        in_ZMM21 = ZEXT3264(local_660);
        auVar232 = ZEXT3264(local_580);
        auVar230 = ZEXT3264(local_6c0);
        if (bVar103 == 0) {
          bVar103 = 0;
          auVar216 = ZEXT3264(auVar114);
          auVar195 = ZEXT3264(auVar116);
        }
        else {
          auVar51._4_4_ = auVar118._4_4_ * auVar130._4_4_;
          auVar51._0_4_ = auVar118._0_4_ * auVar130._0_4_;
          auVar51._8_4_ = auVar118._8_4_ * auVar130._8_4_;
          auVar51._12_4_ = auVar118._12_4_ * auVar130._12_4_;
          auVar51._16_4_ = auVar118._16_4_ * auVar130._16_4_;
          auVar51._20_4_ = auVar118._20_4_ * auVar130._20_4_;
          auVar51._24_4_ = auVar118._24_4_ * auVar130._24_4_;
          auVar51._28_4_ = auVar129._28_4_;
          auVar106 = vfmsub231ps_fma(auVar51,auVar117,auVar128);
          auVar52._4_4_ = auVar128._4_4_ * auVar115._4_4_;
          auVar52._0_4_ = auVar128._0_4_ * auVar115._0_4_;
          auVar52._8_4_ = auVar128._8_4_ * auVar115._8_4_;
          auVar52._12_4_ = auVar128._12_4_ * auVar115._12_4_;
          auVar52._16_4_ = auVar128._16_4_ * auVar115._16_4_;
          auVar52._20_4_ = auVar128._20_4_ * auVar115._20_4_;
          auVar52._24_4_ = auVar128._24_4_ * auVar115._24_4_;
          auVar52._28_4_ = auVar128._28_4_;
          auVar166 = vfmsub231ps_fma(auVar52,auVar113,auVar118);
          auVar53._4_4_ = auVar117._4_4_ * auVar113._4_4_;
          auVar53._0_4_ = auVar117._0_4_ * auVar113._0_4_;
          auVar53._8_4_ = auVar117._8_4_ * auVar113._8_4_;
          auVar53._12_4_ = auVar117._12_4_ * auVar113._12_4_;
          auVar53._16_4_ = auVar117._16_4_ * auVar113._16_4_;
          auVar53._20_4_ = auVar117._20_4_ * auVar113._20_4_;
          auVar53._24_4_ = auVar117._24_4_ * auVar113._24_4_;
          auVar53._28_4_ = auVar117._28_4_;
          auVar10 = vfmsub231ps_fma(auVar53,auVar115,auVar130);
          auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar166),ZEXT1632(auVar10));
          auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),ZEXT1632(auVar106),auVar111);
          auVar130 = vrcp14ps_avx512vl(auVar129);
          auVar29._8_4_ = 0x3f800000;
          auVar29._0_8_ = &DAT_3f8000003f800000;
          auVar29._12_4_ = 0x3f800000;
          auVar29._16_4_ = 0x3f800000;
          auVar29._20_4_ = 0x3f800000;
          auVar29._24_4_ = 0x3f800000;
          auVar29._28_4_ = 0x3f800000;
          auVar128 = vfnmadd213ps_avx512vl(auVar130,auVar129,auVar29);
          auVar107 = vfmadd132ps_fma(auVar128,auVar130,auVar130);
          auVar54._4_4_ = auVar10._4_4_ * auVar135._4_4_;
          auVar54._0_4_ = auVar10._0_4_ * auVar135._0_4_;
          auVar54._8_4_ = auVar10._8_4_ * auVar135._8_4_;
          auVar54._12_4_ = auVar10._12_4_ * auVar135._12_4_;
          auVar54._16_4_ = fVar197 * 0.0;
          auVar54._20_4_ = fVar163 * 0.0;
          auVar54._24_4_ = fVar205 * 0.0;
          auVar54._28_4_ = iVar1;
          auVar166 = vfmadd231ps_fma(auVar54,auVar127,ZEXT1632(auVar166));
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar119,ZEXT1632(auVar106));
          fVar197 = auVar107._0_4_;
          fVar163 = auVar107._4_4_;
          fVar205 = auVar107._8_4_;
          fVar206 = auVar107._12_4_;
          auVar130 = ZEXT1632(CONCAT412(auVar166._12_4_ * fVar206,
                                        CONCAT48(auVar166._8_4_ * fVar205,
                                                 CONCAT44(auVar166._4_4_ * fVar163,
                                                          auVar166._0_4_ * fVar197))));
          auVar219._4_4_ = uVar98;
          auVar219._0_4_ = uVar98;
          auVar219._8_4_ = uVar98;
          auVar219._12_4_ = uVar98;
          auVar219._16_4_ = uVar98;
          auVar219._20_4_ = uVar98;
          auVar219._24_4_ = uVar98;
          auVar219._28_4_ = uVar98;
          uVar176 = vcmpps_avx512vl(auVar219,auVar130,2);
          uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar30._4_4_ = uVar164;
          auVar30._0_4_ = uVar164;
          auVar30._8_4_ = uVar164;
          auVar30._12_4_ = uVar164;
          auVar30._16_4_ = uVar164;
          auVar30._20_4_ = uVar164;
          auVar30._24_4_ = uVar164;
          auVar30._28_4_ = uVar164;
          uVar25 = vcmpps_avx512vl(auVar130,auVar30,2);
          bVar103 = (byte)uVar176 & (byte)uVar25 & bVar103;
          if (bVar103 == 0) {
            bVar103 = 0;
            auVar216 = ZEXT3264(auVar114);
            auVar195 = ZEXT3264(auVar116);
          }
          else {
            uVar176 = vcmpps_avx512vl(auVar129,auVar111,4);
            if ((bVar103 & (byte)uVar176) == 0) {
              bVar103 = 0;
              auVar216 = ZEXT3264(auVar114);
              auVar195 = ZEXT3264(auVar116);
            }
            else {
              bVar103 = bVar103 & (byte)uVar176;
              fVar183 = auVar120._0_4_ * fVar197;
              fVar196 = auVar120._4_4_ * fVar163;
              auVar55._4_4_ = fVar196;
              auVar55._0_4_ = fVar183;
              fVar104 = auVar120._8_4_ * fVar205;
              auVar55._8_4_ = fVar104;
              fVar105 = auVar120._12_4_ * fVar206;
              auVar55._12_4_ = fVar105;
              fVar182 = auVar120._16_4_ * 0.0;
              auVar55._16_4_ = fVar182;
              fVar155 = auVar120._20_4_ * 0.0;
              auVar55._20_4_ = fVar155;
              fVar156 = auVar120._24_4_ * 0.0;
              auVar55._24_4_ = fVar156;
              auVar55._28_4_ = auVar120._28_4_;
              fVar197 = auVar121._0_4_ * fVar197;
              fVar163 = auVar121._4_4_ * fVar163;
              auVar56._4_4_ = fVar163;
              auVar56._0_4_ = fVar197;
              fVar205 = auVar121._8_4_ * fVar205;
              auVar56._8_4_ = fVar205;
              fVar206 = auVar121._12_4_ * fVar206;
              auVar56._12_4_ = fVar206;
              fVar157 = auVar121._16_4_ * 0.0;
              auVar56._16_4_ = fVar157;
              fVar159 = auVar121._20_4_ * 0.0;
              auVar56._20_4_ = fVar159;
              fVar160 = auVar121._24_4_ * 0.0;
              auVar56._24_4_ = fVar160;
              auVar56._28_4_ = auVar121._28_4_;
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = &DAT_3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar116 = vsubps_avx(auVar211,auVar55);
              bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar94 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar94 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar94 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar94 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar94 >> 6) & 1);
              bVar22 = SUB81(uVar94 >> 7,0);
              auVar216 = ZEXT3264(CONCAT428((uint)bVar22 * auVar120._28_4_ |
                                            (uint)!bVar22 * auVar116._28_4_,
                                            CONCAT424((uint)bVar21 * (int)fVar156 |
                                                      (uint)!bVar21 * auVar116._24_4_,
                                                      CONCAT420((uint)bVar20 * (int)fVar155 |
                                                                (uint)!bVar20 * auVar116._20_4_,
                                                                CONCAT416((uint)bVar19 *
                                                                          (int)fVar182 |
                                                                          (uint)!bVar19 *
                                                                          auVar116._16_4_,
                                                                          CONCAT412((uint)bVar18 *
                                                                                    (int)fVar105 |
                                                                                    (uint)!bVar18 *
                                                                                    auVar116._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar17 * (int)fVar104 |
                                                  (uint)!bVar17 * auVar116._8_4_,
                                                  CONCAT44((uint)bVar16 * (int)fVar196 |
                                                           (uint)!bVar16 * auVar116._4_4_,
                                                           (uint)(bVar93 & 1) * (int)fVar183 |
                                                           (uint)!(bool)(bVar93 & 1) *
                                                           auVar116._0_4_))))))));
              auVar116 = vsubps_avx(auVar211,auVar56);
              bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar94 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar94 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar94 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar94 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar94 >> 6) & 1);
              bVar22 = SUB81(uVar94 >> 7,0);
              local_360._4_4_ = (uint)bVar16 * (int)fVar163 | (uint)!bVar16 * auVar116._4_4_;
              local_360._0_4_ =
                   (uint)(bVar93 & 1) * (int)fVar197 | (uint)!(bool)(bVar93 & 1) * auVar116._0_4_;
              local_360._8_4_ = (uint)bVar17 * (int)fVar205 | (uint)!bVar17 * auVar116._8_4_;
              local_360._12_4_ = (uint)bVar18 * (int)fVar206 | (uint)!bVar18 * auVar116._12_4_;
              local_360._16_4_ = (uint)bVar19 * (int)fVar157 | (uint)!bVar19 * auVar116._16_4_;
              local_360._20_4_ = (uint)bVar20 * (int)fVar159 | (uint)!bVar20 * auVar116._20_4_;
              local_360._24_4_ = (uint)bVar21 * (int)fVar160 | (uint)!bVar21 * auVar116._24_4_;
              local_360._28_4_ = (uint)bVar22 * auVar121._28_4_ | (uint)!bVar22 * auVar116._28_4_;
              auVar195 = ZEXT3264(auVar130);
            }
          }
        }
        auVar236 = ZEXT3264(local_6a0);
        auVar235 = ZEXT3264(local_680);
        if (bVar103 != 0) {
          auVar116 = vsubps_avx(ZEXT1632(auVar165),auVar124);
          auVar129 = auVar216._0_32_;
          auVar107 = vfmadd213ps_fma(auVar116,auVar129,auVar124);
          uVar164 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar31._4_4_ = uVar164;
          auVar31._0_4_ = uVar164;
          auVar31._8_4_ = uVar164;
          auVar31._12_4_ = uVar164;
          auVar31._16_4_ = uVar164;
          auVar31._20_4_ = uVar164;
          auVar31._24_4_ = uVar164;
          auVar31._28_4_ = uVar164;
          auVar116 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar107._12_4_ + auVar107._12_4_,
                                                        CONCAT48(auVar107._8_4_ + auVar107._8_4_,
                                                                 CONCAT44(auVar107._4_4_ +
                                                                          auVar107._4_4_,
                                                                          auVar107._0_4_ +
                                                                          auVar107._0_4_)))),auVar31
                                    );
          auVar114 = auVar195._0_32_;
          uVar176 = vcmpps_avx512vl(auVar114,auVar116,6);
          bVar103 = bVar103 & (byte)uVar176;
          if (bVar103 != 0) {
            auVar169._8_4_ = 0xbf800000;
            auVar169._0_8_ = 0xbf800000bf800000;
            auVar169._12_4_ = 0xbf800000;
            auVar169._16_4_ = 0xbf800000;
            auVar169._20_4_ = 0xbf800000;
            auVar169._24_4_ = 0xbf800000;
            auVar169._28_4_ = 0xbf800000;
            auVar32._8_4_ = 0x40000000;
            auVar32._0_8_ = 0x4000000040000000;
            auVar32._12_4_ = 0x40000000;
            auVar32._16_4_ = 0x40000000;
            auVar32._20_4_ = 0x40000000;
            auVar32._24_4_ = 0x40000000;
            auVar32._28_4_ = 0x40000000;
            local_4c0 = vfmadd132ps_avx512vl(local_360,auVar169,auVar32);
            local_360 = local_4c0;
            auVar116 = local_360;
            local_480 = 0;
            local_360 = auVar116;
            if ((pGVar99->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar197 = 1.0 / auVar224._0_4_;
              local_420[0] = fVar197 * (auVar216._0_4_ + 0.0);
              local_420[1] = fVar197 * (auVar216._4_4_ + 1.0);
              local_420[2] = fVar197 * (auVar216._8_4_ + 2.0);
              local_420[3] = fVar197 * (auVar216._12_4_ + 3.0);
              fStack_410 = fVar197 * (auVar216._16_4_ + 4.0);
              fStack_40c = fVar197 * (auVar216._20_4_ + 5.0);
              fStack_408 = fVar197 * (auVar216._24_4_ + 6.0);
              fStack_404 = auVar216._28_4_ + 7.0;
              local_360._0_8_ = local_4c0._0_8_;
              local_360._8_8_ = local_4c0._8_8_;
              local_360._16_8_ = local_4c0._16_8_;
              local_360._24_8_ = local_4c0._24_8_;
              local_400 = local_360._0_8_;
              uStack_3f8 = local_360._8_8_;
              uStack_3f0 = local_360._16_8_;
              uStack_3e8 = local_360._24_8_;
              local_3e0 = auVar114;
              auVar170._8_4_ = 0x7f800000;
              auVar170._0_8_ = 0x7f8000007f800000;
              auVar170._12_4_ = 0x7f800000;
              auVar170._16_4_ = 0x7f800000;
              auVar170._20_4_ = 0x7f800000;
              auVar170._24_4_ = 0x7f800000;
              auVar170._28_4_ = 0x7f800000;
              auVar116 = vblendmps_avx512vl(auVar170,auVar114);
              auVar141._0_4_ =
                   (uint)(bVar103 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar103 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar103 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar103 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar103 >> 3 & 1);
              auVar141._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar103 >> 4 & 1);
              auVar141._16_4_ = (uint)bVar16 * auVar116._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar103 >> 5 & 1);
              auVar141._20_4_ = (uint)bVar16 * auVar116._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar103 >> 6 & 1);
              auVar141._24_4_ = (uint)bVar16 * auVar116._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar141._28_4_ =
                   (uint)(bVar103 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar103 >> 7) * 0x7f800000
              ;
              auVar116 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar116 = vminps_avx(auVar141,auVar116);
              auVar130 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar130);
              auVar130 = vpermpd_avx2(auVar116,0x4e);
              auVar116 = vminps_avx(auVar116,auVar130);
              uVar176 = vcmpps_avx512vl(auVar141,auVar116,0);
              bVar92 = (byte)uVar176 & bVar103;
              bVar93 = bVar103;
              if (bVar92 != 0) {
                bVar93 = bVar92;
              }
              uVar96 = 0;
              for (uVar95 = (uint)bVar93; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                uVar96 = uVar96 + 1;
              }
              uVar94 = (ulong)uVar96;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar99->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar197 = local_420[uVar94];
                uVar164 = *(undefined4 *)((long)&local_400 + uVar94 * 4);
                fVar163 = 1.0 - fVar197;
                auVar106 = vfnmadd231ss_fma(ZEXT416((uint)(fVar197 * (fVar163 + fVar163))),
                                            ZEXT416((uint)fVar163),ZEXT416((uint)fVar163));
                auVar165 = ZEXT416((uint)fVar197);
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                           ZEXT416(0xc0a00000));
                auVar166 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197 * 3.0)),
                                           ZEXT416((uint)(fVar197 + fVar197)),auVar107);
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                           ZEXT416(0x40000000));
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163 * -3.0)),
                                           ZEXT416((uint)(fVar163 + fVar163)),auVar107);
                auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar165,
                                           ZEXT416((uint)(fVar163 * -2.0)));
                fVar163 = auVar106._0_4_ * 0.5;
                fVar205 = auVar166._0_4_ * 0.5;
                fVar206 = auVar107._0_4_ * 0.5;
                fVar183 = auVar165._0_4_ * 0.5;
                auVar185._0_4_ = fVar183 * local_6e0;
                auVar185._4_4_ = fVar183 * fStack_6dc;
                auVar185._8_4_ = fVar183 * fStack_6d8;
                auVar185._12_4_ = fVar183 * fStack_6d4;
                auVar207._4_4_ = fVar206;
                auVar207._0_4_ = fVar206;
                auVar207._8_4_ = fVar206;
                auVar207._12_4_ = fVar206;
                auVar107 = vfmadd132ps_fma(auVar207,auVar185,*pauVar4);
                auVar186._4_4_ = fVar205;
                auVar186._0_4_ = fVar205;
                auVar186._8_4_ = fVar205;
                auVar186._12_4_ = fVar205;
                auVar107 = vfmadd132ps_fma(auVar186,auVar107,*pauVar3);
                auVar216 = ZEXT3264(auVar129);
                auVar180._4_4_ = fVar163;
                auVar180._0_4_ = fVar163;
                auVar180._8_4_ = fVar163;
                auVar180._12_4_ = fVar163;
                auVar107 = vfmadd213ps_fma(auVar180,auVar23,auVar107);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar94 * 4);
                auVar195 = ZEXT3264(auVar114);
                *(int *)(ray + k * 4 + 0x180) = auVar107._0_4_;
                uVar14 = vextractps_avx(auVar107,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar14;
                uVar14 = vextractps_avx(auVar107,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar14;
                *(float *)(ray + k * 4 + 0x1e0) = fVar197;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar164;
                *(uint *)(ray + k * 4 + 0x220) = uVar12;
                *(uint *)(ray + k * 4 + 0x240) = uVar100;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_3c0 = vpbroadcastd_avx512vl();
                local_540 = vpbroadcastd_avx512vl();
                local_5e0 = (undefined4)uVar24;
                uStack_5dc = (undefined4)((ulong)uVar24 >> 0x20);
                local_600 = local_6e0;
                fStack_5fc = fStack_6dc;
                fStack_5f8 = fStack_6d8;
                fStack_5f4 = fStack_6d4;
                local_5f0 = uVar81;
                uStack_5e8 = uVar82;
                uStack_5d8 = uVar26;
                local_4e0 = auVar129;
                local_4a0 = auVar114;
                local_47c = iVar13;
                local_470 = auVar23;
                local_460 = uVar24;
                uStack_458 = uVar26;
                local_450 = uVar81;
                uStack_448 = uVar82;
                local_430 = bVar103;
                do {
                  auVar106 = auVar234._0_16_;
                  local_3a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar197 = local_420[uVar94];
                  auVar178._4_4_ = fVar197;
                  auVar178._0_4_ = fVar197;
                  auVar178._8_4_ = fVar197;
                  auVar178._12_4_ = fVar197;
                  local_280._16_4_ = fVar197;
                  local_280._0_16_ = auVar178;
                  local_280._20_4_ = fVar197;
                  local_280._24_4_ = fVar197;
                  local_280._28_4_ = fVar197;
                  local_260 = *(undefined4 *)((long)&local_400 + uVar94 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar94 * 4);
                  local_710.context = context->user;
                  fVar163 = 1.0 - fVar197;
                  auVar165 = vfnmadd231ss_fma(ZEXT416((uint)(fVar197 * (fVar163 + fVar163))),
                                              ZEXT416((uint)fVar163),ZEXT416((uint)fVar163));
                  auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar178,
                                             ZEXT416(0xc0a00000));
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197 * 3.0)),
                                             ZEXT416((uint)(fVar197 + fVar197)),auVar108);
                  auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar178,
                                             ZEXT416(0x40000000));
                  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163 * -3.0)),
                                             ZEXT416((uint)(fVar163 + fVar163)),auVar108);
                  auVar166 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar178,
                                             ZEXT416((uint)(fVar163 * -2.0)));
                  fVar197 = auVar165._0_4_ * 0.5;
                  fVar163 = auVar107._0_4_ * 0.5;
                  fVar205 = auVar108._0_4_ * 0.5;
                  fVar206 = auVar166._0_4_ * 0.5;
                  auVar191._0_4_ = fVar206 * local_600;
                  auVar191._4_4_ = fVar206 * fStack_5fc;
                  auVar191._8_4_ = fVar206 * fStack_5f8;
                  auVar191._12_4_ = fVar206 * fStack_5f4;
                  auVar210._4_4_ = fVar205;
                  auVar210._0_4_ = fVar205;
                  auVar210._8_4_ = fVar205;
                  auVar210._12_4_ = fVar205;
                  auVar89._8_8_ = uStack_5e8;
                  auVar89._0_8_ = local_5f0;
                  auVar108 = vfmadd132ps_fma(auVar210,auVar191,auVar89);
                  auVar192._4_4_ = fVar163;
                  auVar192._0_4_ = fVar163;
                  auVar192._8_4_ = fVar163;
                  auVar192._12_4_ = fVar163;
                  auVar90._4_4_ = uStack_5dc;
                  auVar90._0_4_ = local_5e0;
                  auVar90._8_8_ = uStack_5d8;
                  auVar108 = vfmadd132ps_fma(auVar192,auVar108,auVar90);
                  auVar168._4_4_ = fVar197;
                  auVar168._0_4_ = fVar197;
                  auVar168._8_4_ = fVar197;
                  auVar168._12_4_ = fVar197;
                  auVar108 = vfmadd213ps_fma(auVar168,auVar23,auVar108);
                  local_2e0 = auVar108._0_4_;
                  auVar204._8_4_ = 1;
                  auVar204._0_8_ = 0x100000001;
                  auVar204._12_4_ = 1;
                  auVar204._16_4_ = 1;
                  auVar204._20_4_ = 1;
                  auVar204._24_4_ = 1;
                  auVar204._28_4_ = 1;
                  local_2c0 = vpermps_avx2(auVar204,ZEXT1632(auVar108));
                  auVar214._8_4_ = 2;
                  auVar214._0_8_ = 0x200000002;
                  auVar214._12_4_ = 2;
                  auVar214._16_4_ = 2;
                  auVar214._20_4_ = 2;
                  auVar214._24_4_ = 2;
                  auVar214._28_4_ = 2;
                  local_2a0 = vpermps_avx2(auVar214,ZEXT1632(auVar108));
                  iStack_2dc = local_2e0;
                  iStack_2d8 = local_2e0;
                  iStack_2d4 = local_2e0;
                  iStack_2d0 = local_2e0;
                  iStack_2cc = local_2e0;
                  iStack_2c8 = local_2e0;
                  iStack_2c4 = local_2e0;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  local_240 = local_540._0_8_;
                  uStack_238 = local_540._8_8_;
                  uStack_230 = local_540._16_8_;
                  uStack_228 = local_540._24_8_;
                  local_220 = local_3c0;
                  auVar116 = vpcmpeqd_avx2(local_3c0,local_3c0);
                  local_6c8[1] = auVar116;
                  *local_6c8 = auVar116;
                  local_200 = (local_710.context)->instID[0];
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = (local_710.context)->instPrimID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_620 = local_320._0_8_;
                  uStack_618 = local_320._8_8_;
                  uStack_610 = local_320._16_8_;
                  uStack_608 = local_320._24_8_;
                  local_710.valid = (int *)&local_620;
                  local_710.geometryUserPtr = pGVar99->userPtr;
                  local_710.hit = (RTCHitN *)&local_2e0;
                  local_710.N = 8;
                  local_520 = (uint)uVar94;
                  uStack_51c = (uint)(uVar94 >> 0x20);
                  local_710.ray = (RTCRayN *)ray;
                  if (pGVar99->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar99->intersectionFilterN)(&local_710);
                    uVar94 = CONCAT44(uStack_51c,local_520);
                    auVar233 = ZEXT1664(local_560._0_16_);
                    auVar236 = ZEXT3264(local_6a0);
                    auVar235 = ZEXT3264(local_680);
                    auVar230 = ZEXT3264(local_6c0);
                    auVar231 = ZEXT3264(local_5a0);
                    auVar232 = ZEXT3264(local_580);
                    in_ZMM21 = ZEXT3264(local_660);
                    in_ZMM20 = ZEXT3264(local_640);
                    auVar108 = vxorps_avx512vl(auVar106,auVar106);
                    auVar234 = ZEXT1664(auVar108);
                    uVar98 = local_5c0._0_4_;
                  }
                  auVar108 = auVar234._0_16_;
                  auVar85._8_8_ = uStack_618;
                  auVar85._0_8_ = local_620;
                  auVar85._16_8_ = uStack_610;
                  auVar85._24_8_ = uStack_608;
                  if (auVar85 == (undefined1  [32])0x0) {
LAB_01dc5864:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_3a0._0_4_;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar99->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_710);
                      uVar94 = CONCAT44(uStack_51c,local_520);
                      auVar233 = ZEXT1664(local_560._0_16_);
                      auVar236 = ZEXT3264(local_6a0);
                      auVar235 = ZEXT3264(local_680);
                      auVar230 = ZEXT3264(local_6c0);
                      auVar231 = ZEXT3264(local_5a0);
                      auVar232 = ZEXT3264(local_580);
                      in_ZMM21 = ZEXT3264(local_660);
                      in_ZMM20 = ZEXT3264(local_640);
                      auVar108 = vxorps_avx512vl(auVar108,auVar108);
                      auVar234 = ZEXT1664(auVar108);
                      uVar98 = local_5c0._0_4_;
                    }
                    auVar86._8_8_ = uStack_618;
                    auVar86._0_8_ = local_620;
                    auVar86._16_8_ = uStack_610;
                    auVar86._24_8_ = uStack_608;
                    if (auVar86 == (undefined1  [32])0x0) goto LAB_01dc5864;
                    uVar97 = vptestmd_avx512vl(auVar86,auVar86);
                    iVar1 = *(int *)(local_710.hit + 4);
                    iVar2 = *(int *)(local_710.hit + 8);
                    iVar76 = *(int *)(local_710.hit + 0xc);
                    iVar77 = *(int *)(local_710.hit + 0x10);
                    iVar78 = *(int *)(local_710.hit + 0x14);
                    iVar79 = *(int *)(local_710.hit + 0x18);
                    iVar80 = *(int *)(local_710.hit + 0x1c);
                    bVar93 = (byte)uVar97;
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                    bVar22 = SUB81(uVar97 >> 7,0);
                    *(uint *)(local_710.ray + 0x180) =
                         (uint)(bVar93 & 1) * *(int *)local_710.hit |
                         (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x180);
                    *(uint *)(local_710.ray + 0x184) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x184);
                    *(uint *)(local_710.ray + 0x188) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x188);
                    *(uint *)(local_710.ray + 0x18c) =
                         (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x18c);
                    *(uint *)(local_710.ray + 400) =
                         (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 400);
                    *(uint *)(local_710.ray + 0x194) =
                         (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 0x194);
                    *(uint *)(local_710.ray + 0x198) =
                         (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x198);
                    *(uint *)(local_710.ray + 0x19c) =
                         (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x19c);
                    iVar1 = *(int *)(local_710.hit + 0x24);
                    iVar2 = *(int *)(local_710.hit + 0x28);
                    iVar76 = *(int *)(local_710.hit + 0x2c);
                    iVar77 = *(int *)(local_710.hit + 0x30);
                    iVar78 = *(int *)(local_710.hit + 0x34);
                    iVar79 = *(int *)(local_710.hit + 0x38);
                    iVar80 = *(int *)(local_710.hit + 0x3c);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                    bVar22 = SUB81(uVar97 >> 7,0);
                    *(uint *)(local_710.ray + 0x1a0) =
                         (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x20) |
                         (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x1a0);
                    *(uint *)(local_710.ray + 0x1a4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x1a4);
                    *(uint *)(local_710.ray + 0x1a8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x1a8);
                    *(uint *)(local_710.ray + 0x1ac) =
                         (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x1ac);
                    *(uint *)(local_710.ray + 0x1b0) =
                         (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 0x1b0);
                    *(uint *)(local_710.ray + 0x1b4) =
                         (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 0x1b4);
                    *(uint *)(local_710.ray + 0x1b8) =
                         (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x1b8);
                    *(uint *)(local_710.ray + 0x1bc) =
                         (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x1bc);
                    iVar1 = *(int *)(local_710.hit + 0x44);
                    iVar2 = *(int *)(local_710.hit + 0x48);
                    iVar76 = *(int *)(local_710.hit + 0x4c);
                    iVar77 = *(int *)(local_710.hit + 0x50);
                    iVar78 = *(int *)(local_710.hit + 0x54);
                    iVar79 = *(int *)(local_710.hit + 0x58);
                    iVar80 = *(int *)(local_710.hit + 0x5c);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                    bVar22 = SUB81(uVar97 >> 7,0);
                    *(uint *)(local_710.ray + 0x1c0) =
                         (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x40) |
                         (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x1c0);
                    *(uint *)(local_710.ray + 0x1c4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x1c4);
                    *(uint *)(local_710.ray + 0x1c8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x1c8);
                    *(uint *)(local_710.ray + 0x1cc) =
                         (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x1cc);
                    *(uint *)(local_710.ray + 0x1d0) =
                         (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 0x1d0);
                    *(uint *)(local_710.ray + 0x1d4) =
                         (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 0x1d4);
                    *(uint *)(local_710.ray + 0x1d8) =
                         (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x1d8);
                    *(uint *)(local_710.ray + 0x1dc) =
                         (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x1dc);
                    iVar1 = *(int *)(local_710.hit + 100);
                    iVar2 = *(int *)(local_710.hit + 0x68);
                    iVar76 = *(int *)(local_710.hit + 0x6c);
                    iVar77 = *(int *)(local_710.hit + 0x70);
                    iVar78 = *(int *)(local_710.hit + 0x74);
                    iVar79 = *(int *)(local_710.hit + 0x78);
                    iVar80 = *(int *)(local_710.hit + 0x7c);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                    bVar22 = SUB81(uVar97 >> 7,0);
                    *(uint *)(local_710.ray + 0x1e0) =
                         (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x60) |
                         (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x1e0);
                    *(uint *)(local_710.ray + 0x1e4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x1e4);
                    *(uint *)(local_710.ray + 0x1e8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x1e8);
                    *(uint *)(local_710.ray + 0x1ec) =
                         (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x1ec);
                    *(uint *)(local_710.ray + 0x1f0) =
                         (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 0x1f0);
                    *(uint *)(local_710.ray + 500) =
                         (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 500);
                    *(uint *)(local_710.ray + 0x1f8) =
                         (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x1f8);
                    *(uint *)(local_710.ray + 0x1fc) =
                         (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x1fc);
                    auVar153._0_4_ =
                         (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x80) |
                         (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x200);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar153._4_4_ =
                         (uint)bVar16 * *(int *)(local_710.hit + 0x84) |
                         (uint)!bVar16 * *(int *)(local_710.ray + 0x204);
                    bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar153._8_4_ =
                         (uint)bVar16 * *(int *)(local_710.hit + 0x88) |
                         (uint)!bVar16 * *(int *)(local_710.ray + 0x208);
                    bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
                    auVar153._12_4_ =
                         (uint)bVar16 * *(int *)(local_710.hit + 0x8c) |
                         (uint)!bVar16 * *(int *)(local_710.ray + 0x20c);
                    bVar16 = (bool)((byte)(uVar97 >> 4) & 1);
                    auVar153._16_4_ =
                         (uint)bVar16 * *(int *)(local_710.hit + 0x90) |
                         (uint)!bVar16 * *(int *)(local_710.ray + 0x210);
                    bVar16 = (bool)((byte)(uVar97 >> 5) & 1);
                    auVar153._20_4_ =
                         (uint)bVar16 * *(int *)(local_710.hit + 0x94) |
                         (uint)!bVar16 * *(int *)(local_710.ray + 0x214);
                    bVar16 = (bool)((byte)(uVar97 >> 6) & 1);
                    auVar153._24_4_ =
                         (uint)bVar16 * *(int *)(local_710.hit + 0x98) |
                         (uint)!bVar16 * *(int *)(local_710.ray + 0x218);
                    bVar16 = SUB81(uVar97 >> 7,0);
                    auVar153._28_4_ =
                         (uint)bVar16 * *(int *)(local_710.hit + 0x9c) |
                         (uint)!bVar16 * *(int *)(local_710.ray + 0x21c);
                    *(undefined1 (*) [32])(local_710.ray + 0x200) = auVar153;
                    auVar116 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0xa0));
                    *(undefined1 (*) [32])(local_710.ray + 0x220) = auVar116;
                    auVar116 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0xc0));
                    *(undefined1 (*) [32])(local_710.ray + 0x240) = auVar116;
                    auVar116 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0xe0));
                    *(undefined1 (*) [32])(local_710.ray + 0x260) = auVar116;
                    auVar116 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0x100));
                    *(undefined1 (*) [32])(local_710.ray + 0x280) = auVar116;
                  }
                  auVar216 = ZEXT3264(auVar129);
                  auVar195 = ZEXT3264(auVar114);
                  auVar108 = auVar233._0_16_;
                  bVar93 = ~(byte)(1 << ((uint)uVar94 & 0x1f)) & bVar103;
                  uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar39._4_4_ = uVar164;
                  auVar39._0_4_ = uVar164;
                  auVar39._8_4_ = uVar164;
                  auVar39._12_4_ = uVar164;
                  auVar39._16_4_ = uVar164;
                  auVar39._20_4_ = uVar164;
                  auVar39._24_4_ = uVar164;
                  auVar39._28_4_ = uVar164;
                  uVar176 = vcmpps_avx512vl(auVar114,auVar39,2);
                  bVar103 = bVar93 & (byte)uVar176;
                  if ((bVar93 & (byte)uVar176) != 0) {
                    auVar175._8_4_ = 0x7f800000;
                    auVar175._0_8_ = 0x7f8000007f800000;
                    auVar175._12_4_ = 0x7f800000;
                    auVar175._16_4_ = 0x7f800000;
                    auVar175._20_4_ = 0x7f800000;
                    auVar175._24_4_ = 0x7f800000;
                    auVar175._28_4_ = 0x7f800000;
                    auVar116 = vblendmps_avx512vl(auVar175,auVar114);
                    auVar154._0_4_ =
                         (uint)(bVar103 & 1) * auVar116._0_4_ |
                         (uint)!(bool)(bVar103 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar103 >> 1 & 1);
                    auVar154._4_4_ = (uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar103 >> 2 & 1);
                    auVar154._8_4_ = (uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar103 >> 3 & 1);
                    auVar154._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar103 >> 4 & 1);
                    auVar154._16_4_ = (uint)bVar16 * auVar116._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar103 >> 5 & 1);
                    auVar154._20_4_ = (uint)bVar16 * auVar116._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar103 >> 6 & 1);
                    auVar154._24_4_ = (uint)bVar16 * auVar116._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar154._28_4_ =
                         (uint)(bVar103 >> 7) * auVar116._28_4_ |
                         (uint)!(bool)(bVar103 >> 7) * 0x7f800000;
                    auVar116 = vshufps_avx(auVar154,auVar154,0xb1);
                    auVar116 = vminps_avx(auVar154,auVar116);
                    auVar130 = vshufpd_avx(auVar116,auVar116,5);
                    auVar116 = vminps_avx(auVar116,auVar130);
                    auVar130 = vpermpd_avx2(auVar116,0x4e);
                    auVar116 = vminps_avx(auVar116,auVar130);
                    uVar176 = vcmpps_avx512vl(auVar154,auVar116,0);
                    bVar92 = (byte)uVar176 & bVar103;
                    bVar93 = bVar103;
                    if (bVar92 != 0) {
                      bVar93 = bVar92;
                    }
                    uVar96 = 0;
                    for (uVar95 = (uint)bVar93; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000
                        ) {
                      uVar96 = uVar96 + 1;
                    }
                    uVar94 = (ulong)uVar96;
                  }
                } while (bVar103 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar13) {
        local_560 = vpbroadcastd_avx512vl();
        local_5c0 = vbroadcastss_avx512vl(auVar108);
        fStack_4f0 = 1.0 / local_500;
        auStack_4fc._0_4_ = fStack_4f0;
        local_500 = fStack_4f0;
        auStack_4fc._4_4_ = fStack_4f0;
        fStack_4f4 = fStack_4f0;
        local_3a0 = vpbroadcastd_avx512vl();
        local_3c0 = vpbroadcastd_avx512vl();
        lVar102 = 8;
        auVar114 = auVar216._0_32_;
        auVar116 = auVar195._0_32_;
        local_520 = uVar98;
        uStack_51c = uVar98;
        uStack_518 = uVar98;
        uStack_514 = uVar98;
        uStack_510 = uVar98;
        uStack_50c = uVar98;
        uStack_508 = uVar98;
        uStack_504 = uVar98;
        fStack_4ec = fStack_4f0;
        fStack_4e8 = fStack_4f0;
        fStack_4e4 = fStack_4f0;
        do {
          auVar129 = vpbroadcastd_avx512vl();
          auVar117 = vpor_avx2(auVar129,_DAT_0205a920);
          uVar25 = vpcmpd_avx512vl(auVar117,local_560,1);
          auVar129 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar102 * 4 + lVar27);
          auVar130 = *(undefined1 (*) [32])(lVar27 + 0x22307f0 + lVar102 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar27 + 0x2230c74 + lVar102 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar27 + 0x22310f8 + lVar102 * 4);
          local_680 = auVar235._0_32_;
          auVar118 = vmulps_avx512vl(local_680,auVar115);
          local_6a0 = auVar236._0_32_;
          auVar119 = vmulps_avx512vl(local_6a0,auVar115);
          auVar57._4_4_ = auVar115._4_4_ * (float)local_140._4_4_;
          auVar57._0_4_ = auVar115._0_4_ * (float)local_140._0_4_;
          auVar57._8_4_ = auVar115._8_4_ * fStack_138;
          auVar57._12_4_ = auVar115._12_4_ * fStack_134;
          auVar57._16_4_ = auVar115._16_4_ * fStack_130;
          auVar57._20_4_ = auVar115._20_4_ * fStack_12c;
          auVar57._24_4_ = auVar115._24_4_ * fStack_128;
          auVar57._28_4_ = auVar117._28_4_;
          auVar117 = vfmadd231ps_avx512vl(auVar118,auVar128,local_e0);
          auVar118 = vfmadd231ps_avx512vl(auVar119,auVar128,local_100);
          auVar119 = vfmadd231ps_avx512vl(auVar57,auVar128,local_120);
          auVar126 = auVar230._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar130,auVar126);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar130,local_300);
          auVar108 = vfmadd231ps_fma(auVar119,auVar130,local_c0);
          auVar218 = auVar232._0_32_;
          auVar121 = vfmadd231ps_avx512vl(auVar117,auVar129,auVar218);
          auVar215 = auVar231._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar118,auVar129,auVar215);
          auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar102 * 4 + lVar27);
          auVar118 = *(undefined1 (*) [32])(lVar27 + 0x2232c10 + lVar102 * 4);
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar129,local_a0);
          auVar119 = *(undefined1 (*) [32])(lVar27 + 0x2233094 + lVar102 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar27 + 0x2233518 + lVar102 * 4);
          auVar113 = vmulps_avx512vl(local_680,auVar127);
          auVar120 = vmulps_avx512vl(local_6a0,auVar127);
          auVar58._4_4_ = auVar127._4_4_ * (float)local_140._4_4_;
          auVar58._0_4_ = auVar127._0_4_ * (float)local_140._0_4_;
          auVar58._8_4_ = auVar127._8_4_ * fStack_138;
          auVar58._12_4_ = auVar127._12_4_ * fStack_134;
          auVar58._16_4_ = auVar127._16_4_ * fStack_130;
          auVar58._20_4_ = auVar127._20_4_ * fStack_12c;
          auVar58._24_4_ = auVar127._24_4_ * fStack_128;
          auVar58._28_4_ = uStack_124;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar119,local_e0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar119,local_100);
          auVar112 = vfmadd231ps_avx512vl(auVar58,auVar119,local_120);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,auVar126);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar118,local_300);
          auVar107 = vfmadd231ps_fma(auVar112,auVar118,local_c0);
          auVar112 = vfmadd231ps_avx512vl(auVar113,auVar117,auVar218);
          auVar122 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar215);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar117,local_a0);
          auVar123 = vmaxps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar107));
          auVar113 = vsubps_avx(auVar112,auVar121);
          auVar120 = vsubps_avx(auVar122,auVar111);
          auVar124 = vmulps_avx512vl(auVar111,auVar113);
          auVar125 = vmulps_avx512vl(auVar121,auVar120);
          auVar124 = vsubps_avx512vl(auVar124,auVar125);
          auVar125 = vmulps_avx512vl(auVar120,auVar120);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar113,auVar113);
          auVar123 = vmulps_avx512vl(auVar123,auVar123);
          auVar123 = vmulps_avx512vl(auVar123,auVar125);
          auVar124 = vmulps_avx512vl(auVar124,auVar124);
          uVar176 = vcmpps_avx512vl(auVar124,auVar123,2);
          local_430 = (byte)uVar25 & (byte)uVar176;
          if (local_430 == 0) {
            auVar233 = ZEXT3264(auVar215);
            auVar230 = ZEXT3264(auVar126);
          }
          else {
            auVar127 = vmulps_avx512vl(local_1c0,auVar127);
            auVar119 = vfmadd213ps_avx512vl(auVar119,local_1a0,auVar127);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_180,auVar119);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_160,auVar118);
            auVar115 = vmulps_avx512vl(local_1c0,auVar115);
            auVar128 = vfmadd213ps_avx512vl(auVar128,local_1a0,auVar115);
            auVar130 = vfmadd213ps_avx512vl(auVar130,local_180,auVar128);
            auVar118 = vfmadd213ps_avx512vl(auVar129,local_160,auVar130);
            auVar129 = *(undefined1 (*) [32])(lVar27 + 0x223157c + lVar102 * 4);
            auVar130 = *(undefined1 (*) [32])(lVar27 + 0x2231a00 + lVar102 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar27 + 0x2231e84 + lVar102 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2232308 + lVar102 * 4);
            auVar119 = vmulps_avx512vl(local_680,auVar115);
            auVar127 = vmulps_avx512vl(local_6a0,auVar115);
            auVar115 = vmulps_avx512vl(local_1c0,auVar115);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar128,local_e0);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar128,local_100);
            auVar128 = vfmadd231ps_avx512vl(auVar115,local_1a0,auVar128);
            auVar115 = vfmadd231ps_avx512vl(auVar119,auVar130,auVar126);
            auVar119 = vfmadd231ps_avx512vl(auVar127,auVar130,local_300);
            auVar130 = vfmadd231ps_avx512vl(auVar128,local_180,auVar130);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar129,auVar218);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar129,auVar215);
            auVar127 = vfmadd231ps_avx512vl(auVar130,local_160,auVar129);
            auVar129 = *(undefined1 (*) [32])(lVar27 + 0x223399c + lVar102 * 4);
            auVar130 = *(undefined1 (*) [32])(lVar27 + 0x22342a4 + lVar102 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar27 + 0x2234728 + lVar102 * 4);
            auVar123 = vmulps_avx512vl(local_680,auVar128);
            auVar124 = vmulps_avx512vl(local_6a0,auVar128);
            auVar128 = vmulps_avx512vl(local_1c0,auVar128);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar130,local_e0);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar130,local_100);
            auVar128 = vfmadd231ps_avx512vl(auVar128,local_1a0,auVar130);
            auVar130 = *(undefined1 (*) [32])(lVar27 + 0x2233e20 + lVar102 * 4);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar130,auVar126);
            auVar166 = vfmadd231ps_fma(auVar124,auVar130,local_300);
            auVar130 = vfmadd231ps_avx512vl(auVar128,local_180,auVar130);
            auVar128 = vfmadd231ps_avx512vl(auVar123,auVar129,auVar218);
            auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar166),auVar129,auVar215);
            auVar130 = vfmadd231ps_avx512vl(auVar130,local_160,auVar129);
            auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar115,auVar124);
            vandps_avx512vl(auVar119,auVar124);
            auVar129 = vmaxps_avx(auVar124,auVar124);
            vandps_avx512vl(auVar127,auVar124);
            auVar129 = vmaxps_avx(auVar129,auVar124);
            uVar94 = vcmpps_avx512vl(auVar129,local_5c0,1);
            bVar16 = (bool)((byte)uVar94 & 1);
            auVar142._0_4_ = (float)((uint)bVar16 * auVar113._0_4_ | (uint)!bVar16 * auVar115._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar16 * auVar113._4_4_ | (uint)!bVar16 * auVar115._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar16 * auVar113._8_4_ | (uint)!bVar16 * auVar115._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar16 * auVar113._12_4_ | (uint)!bVar16 * auVar115._12_4_);
            bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
            auVar142._16_4_ =
                 (float)((uint)bVar16 * auVar113._16_4_ | (uint)!bVar16 * auVar115._16_4_);
            bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
            auVar142._20_4_ =
                 (float)((uint)bVar16 * auVar113._20_4_ | (uint)!bVar16 * auVar115._20_4_);
            bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
            auVar142._24_4_ =
                 (float)((uint)bVar16 * auVar113._24_4_ | (uint)!bVar16 * auVar115._24_4_);
            bVar16 = SUB81(uVar94 >> 7,0);
            auVar142._28_4_ = (uint)bVar16 * auVar113._28_4_ | (uint)!bVar16 * auVar115._28_4_;
            bVar16 = (bool)((byte)uVar94 & 1);
            auVar143._0_4_ = (float)((uint)bVar16 * auVar120._0_4_ | (uint)!bVar16 * auVar119._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar16 * auVar120._4_4_ | (uint)!bVar16 * auVar119._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar16 * auVar120._8_4_ | (uint)!bVar16 * auVar119._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar16 * auVar120._12_4_ | (uint)!bVar16 * auVar119._12_4_);
            bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
            auVar143._16_4_ =
                 (float)((uint)bVar16 * auVar120._16_4_ | (uint)!bVar16 * auVar119._16_4_);
            bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
            auVar143._20_4_ =
                 (float)((uint)bVar16 * auVar120._20_4_ | (uint)!bVar16 * auVar119._20_4_);
            bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
            auVar143._24_4_ =
                 (float)((uint)bVar16 * auVar120._24_4_ | (uint)!bVar16 * auVar119._24_4_);
            bVar16 = SUB81(uVar94 >> 7,0);
            auVar143._28_4_ = (uint)bVar16 * auVar120._28_4_ | (uint)!bVar16 * auVar119._28_4_;
            vandps_avx512vl(auVar128,auVar124);
            vandps_avx512vl(auVar123,auVar124);
            auVar129 = vmaxps_avx(auVar143,auVar143);
            vandps_avx512vl(auVar130,auVar124);
            auVar129 = vmaxps_avx(auVar129,auVar143);
            uVar94 = vcmpps_avx512vl(auVar129,local_5c0,1);
            bVar16 = (bool)((byte)uVar94 & 1);
            auVar144._0_4_ = (uint)bVar16 * auVar113._0_4_ | (uint)!bVar16 * auVar128._0_4_;
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar16 * auVar113._4_4_ | (uint)!bVar16 * auVar128._4_4_;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar16 * auVar113._8_4_ | (uint)!bVar16 * auVar128._8_4_;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar16 * auVar113._12_4_ | (uint)!bVar16 * auVar128._12_4_;
            bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
            auVar144._16_4_ = (uint)bVar16 * auVar113._16_4_ | (uint)!bVar16 * auVar128._16_4_;
            bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
            auVar144._20_4_ = (uint)bVar16 * auVar113._20_4_ | (uint)!bVar16 * auVar128._20_4_;
            bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
            auVar144._24_4_ = (uint)bVar16 * auVar113._24_4_ | (uint)!bVar16 * auVar128._24_4_;
            bVar16 = SUB81(uVar94 >> 7,0);
            auVar144._28_4_ = (uint)bVar16 * auVar113._28_4_ | (uint)!bVar16 * auVar128._28_4_;
            bVar16 = (bool)((byte)uVar94 & 1);
            auVar145._0_4_ = (float)((uint)bVar16 * auVar120._0_4_ | (uint)!bVar16 * auVar123._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar16 * auVar120._4_4_ | (uint)!bVar16 * auVar123._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar16 * auVar120._8_4_ | (uint)!bVar16 * auVar123._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar16 * auVar120._12_4_ | (uint)!bVar16 * auVar123._12_4_);
            bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
            auVar145._16_4_ =
                 (float)((uint)bVar16 * auVar120._16_4_ | (uint)!bVar16 * auVar123._16_4_);
            bVar16 = (bool)((byte)(uVar94 >> 5) & 1);
            auVar145._20_4_ =
                 (float)((uint)bVar16 * auVar120._20_4_ | (uint)!bVar16 * auVar123._20_4_);
            bVar16 = (bool)((byte)(uVar94 >> 6) & 1);
            auVar145._24_4_ =
                 (float)((uint)bVar16 * auVar120._24_4_ | (uint)!bVar16 * auVar123._24_4_);
            bVar16 = SUB81(uVar94 >> 7,0);
            auVar145._28_4_ = (uint)bVar16 * auVar120._28_4_ | (uint)!bVar16 * auVar123._28_4_;
            auVar222._8_4_ = 0x80000000;
            auVar222._0_8_ = 0x8000000080000000;
            auVar222._12_4_ = 0x80000000;
            auVar222._16_4_ = 0x80000000;
            auVar222._20_4_ = 0x80000000;
            auVar222._24_4_ = 0x80000000;
            auVar222._28_4_ = 0x80000000;
            auVar129 = vxorps_avx512vl(auVar144,auVar222);
            auVar123 = auVar234._0_32_;
            auVar130 = vfmadd213ps_avx512vl(auVar142,auVar142,auVar123);
            auVar166 = vfmadd231ps_fma(auVar130,auVar143,auVar143);
            auVar130 = vrsqrt14ps_avx512vl(ZEXT1632(auVar166));
            auVar229._8_4_ = 0xbf000000;
            auVar229._0_8_ = 0xbf000000bf000000;
            auVar229._12_4_ = 0xbf000000;
            auVar229._16_4_ = 0xbf000000;
            auVar229._20_4_ = 0xbf000000;
            auVar229._24_4_ = 0xbf000000;
            auVar229._28_4_ = 0xbf000000;
            fVar197 = auVar130._0_4_;
            fVar163 = auVar130._4_4_;
            fVar205 = auVar130._8_4_;
            fVar206 = auVar130._12_4_;
            fVar183 = auVar130._16_4_;
            fVar196 = auVar130._20_4_;
            fVar104 = auVar130._24_4_;
            auVar59._4_4_ = fVar163 * fVar163 * fVar163 * auVar166._4_4_ * -0.5;
            auVar59._0_4_ = fVar197 * fVar197 * fVar197 * auVar166._0_4_ * -0.5;
            auVar59._8_4_ = fVar205 * fVar205 * fVar205 * auVar166._8_4_ * -0.5;
            auVar59._12_4_ = fVar206 * fVar206 * fVar206 * auVar166._12_4_ * -0.5;
            auVar59._16_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar59._20_4_ = fVar196 * fVar196 * fVar196 * -0.0;
            auVar59._24_4_ = fVar104 * fVar104 * fVar104 * -0.0;
            auVar59._28_4_ = auVar143._28_4_;
            auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar130 = vfmadd231ps_avx512vl(auVar59,auVar128,auVar130);
            auVar60._4_4_ = auVar143._4_4_ * auVar130._4_4_;
            auVar60._0_4_ = auVar143._0_4_ * auVar130._0_4_;
            auVar60._8_4_ = auVar143._8_4_ * auVar130._8_4_;
            auVar60._12_4_ = auVar143._12_4_ * auVar130._12_4_;
            auVar60._16_4_ = auVar143._16_4_ * auVar130._16_4_;
            auVar60._20_4_ = auVar143._20_4_ * auVar130._20_4_;
            auVar60._24_4_ = auVar143._24_4_ * auVar130._24_4_;
            auVar60._28_4_ = 0;
            auVar61._4_4_ = auVar130._4_4_ * -auVar142._4_4_;
            auVar61._0_4_ = auVar130._0_4_ * -auVar142._0_4_;
            auVar61._8_4_ = auVar130._8_4_ * -auVar142._8_4_;
            auVar61._12_4_ = auVar130._12_4_ * -auVar142._12_4_;
            auVar61._16_4_ = auVar130._16_4_ * -auVar142._16_4_;
            auVar61._20_4_ = auVar130._20_4_ * -auVar142._20_4_;
            auVar61._24_4_ = auVar130._24_4_ * -auVar142._24_4_;
            auVar61._28_4_ = auVar143._28_4_;
            auVar115 = vmulps_avx512vl(auVar130,auVar123);
            auVar130 = vfmadd213ps_avx512vl(auVar144,auVar144,auVar123);
            auVar130 = vfmadd231ps_avx512vl(auVar130,auVar145,auVar145);
            auVar119 = vrsqrt14ps_avx512vl(auVar130);
            auVar130 = vmulps_avx512vl(auVar130,auVar229);
            fVar197 = auVar119._0_4_;
            fVar163 = auVar119._4_4_;
            fVar205 = auVar119._8_4_;
            fVar206 = auVar119._12_4_;
            fVar183 = auVar119._16_4_;
            fVar196 = auVar119._20_4_;
            fVar104 = auVar119._24_4_;
            auVar62._4_4_ = fVar163 * fVar163 * fVar163 * auVar130._4_4_;
            auVar62._0_4_ = fVar197 * fVar197 * fVar197 * auVar130._0_4_;
            auVar62._8_4_ = fVar205 * fVar205 * fVar205 * auVar130._8_4_;
            auVar62._12_4_ = fVar206 * fVar206 * fVar206 * auVar130._12_4_;
            auVar62._16_4_ = fVar183 * fVar183 * fVar183 * auVar130._16_4_;
            auVar62._20_4_ = fVar196 * fVar196 * fVar196 * auVar130._20_4_;
            auVar62._24_4_ = fVar104 * fVar104 * fVar104 * auVar130._24_4_;
            auVar62._28_4_ = auVar130._28_4_;
            auVar130 = vfmadd231ps_avx512vl(auVar62,auVar128,auVar119);
            auVar63._4_4_ = auVar145._4_4_ * auVar130._4_4_;
            auVar63._0_4_ = auVar145._0_4_ * auVar130._0_4_;
            auVar63._8_4_ = auVar145._8_4_ * auVar130._8_4_;
            auVar63._12_4_ = auVar145._12_4_ * auVar130._12_4_;
            auVar63._16_4_ = auVar145._16_4_ * auVar130._16_4_;
            auVar63._20_4_ = auVar145._20_4_ * auVar130._20_4_;
            auVar63._24_4_ = auVar145._24_4_ * auVar130._24_4_;
            auVar63._28_4_ = auVar119._28_4_;
            auVar64._4_4_ = auVar130._4_4_ * auVar129._4_4_;
            auVar64._0_4_ = auVar130._0_4_ * auVar129._0_4_;
            auVar64._8_4_ = auVar130._8_4_ * auVar129._8_4_;
            auVar64._12_4_ = auVar130._12_4_ * auVar129._12_4_;
            auVar64._16_4_ = auVar130._16_4_ * auVar129._16_4_;
            auVar64._20_4_ = auVar130._20_4_ * auVar129._20_4_;
            auVar64._24_4_ = auVar130._24_4_ * auVar129._24_4_;
            auVar64._28_4_ = auVar129._28_4_;
            auVar129 = vmulps_avx512vl(auVar130,auVar123);
            auVar166 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar108),auVar121);
            auVar130 = ZEXT1632(auVar108);
            auVar165 = vfmadd213ps_fma(auVar61,auVar130,auVar111);
            auVar128 = vfmadd213ps_avx512vl(auVar115,auVar130,auVar118);
            auVar119 = vfmadd213ps_avx512vl(auVar63,ZEXT1632(auVar107),auVar112);
            auVar28 = vfnmadd213ps_fma(auVar60,auVar130,auVar121);
            auVar127 = ZEXT1632(auVar107);
            auVar106 = vfmadd213ps_fma(auVar64,auVar127,auVar122);
            auVar109 = vfnmadd213ps_fma(auVar61,auVar130,auVar111);
            auVar10 = vfmadd213ps_fma(auVar129,auVar127,auVar117);
            auVar111 = ZEXT1632(auVar108);
            auVar221 = vfnmadd231ps_fma(auVar118,auVar111,auVar115);
            auVar217 = vfnmadd213ps_fma(auVar63,auVar127,auVar112);
            auVar220 = vfnmadd213ps_fma(auVar64,auVar127,auVar122);
            auVar110 = vfnmadd231ps_fma(auVar117,ZEXT1632(auVar107),auVar129);
            auVar117 = vsubps_avx512vl(auVar119,ZEXT1632(auVar28));
            auVar129 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar109));
            auVar130 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar221));
            auVar65._4_4_ = auVar129._4_4_ * auVar221._4_4_;
            auVar65._0_4_ = auVar129._0_4_ * auVar221._0_4_;
            auVar65._8_4_ = auVar129._8_4_ * auVar221._8_4_;
            auVar65._12_4_ = auVar129._12_4_ * auVar221._12_4_;
            auVar65._16_4_ = auVar129._16_4_ * 0.0;
            auVar65._20_4_ = auVar129._20_4_ * 0.0;
            auVar65._24_4_ = auVar129._24_4_ * 0.0;
            auVar65._28_4_ = auVar115._28_4_;
            auVar108 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar109),auVar130);
            auVar66._4_4_ = auVar130._4_4_ * auVar28._4_4_;
            auVar66._0_4_ = auVar130._0_4_ * auVar28._0_4_;
            auVar66._8_4_ = auVar130._8_4_ * auVar28._8_4_;
            auVar66._12_4_ = auVar130._12_4_ * auVar28._12_4_;
            auVar66._16_4_ = auVar130._16_4_ * 0.0;
            auVar66._20_4_ = auVar130._20_4_ * 0.0;
            auVar66._24_4_ = auVar130._24_4_ * 0.0;
            auVar66._28_4_ = auVar130._28_4_;
            auVar179 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar221),auVar117);
            auVar67._4_4_ = auVar109._4_4_ * auVar117._4_4_;
            auVar67._0_4_ = auVar109._0_4_ * auVar117._0_4_;
            auVar67._8_4_ = auVar109._8_4_ * auVar117._8_4_;
            auVar67._12_4_ = auVar109._12_4_ * auVar117._12_4_;
            auVar67._16_4_ = auVar117._16_4_ * 0.0;
            auVar67._20_4_ = auVar117._20_4_ * 0.0;
            auVar67._24_4_ = auVar117._24_4_ * 0.0;
            auVar67._28_4_ = auVar117._28_4_;
            auVar184 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar28),auVar129);
            auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar123,ZEXT1632(auVar179));
            auVar129 = vfmadd231ps_avx512vl(auVar129,auVar123,ZEXT1632(auVar108));
            uVar94 = vcmpps_avx512vl(auVar129,auVar123,2);
            bVar103 = (byte)uVar94;
            fVar155 = (float)((uint)(bVar103 & 1) * auVar166._0_4_ |
                             (uint)!(bool)(bVar103 & 1) * auVar217._0_4_);
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            fVar157 = (float)((uint)bVar16 * auVar166._4_4_ | (uint)!bVar16 * auVar217._4_4_);
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            fVar160 = (float)((uint)bVar16 * auVar166._8_4_ | (uint)!bVar16 * auVar217._8_4_);
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            fVar161 = (float)((uint)bVar16 * auVar166._12_4_ | (uint)!bVar16 * auVar217._12_4_);
            auVar127 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar160,CONCAT44(fVar157,fVar155))));
            fVar156 = (float)((uint)(bVar103 & 1) * auVar165._0_4_ |
                             (uint)!(bool)(bVar103 & 1) * auVar220._0_4_);
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            fVar159 = (float)((uint)bVar16 * auVar165._4_4_ | (uint)!bVar16 * auVar220._4_4_);
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            fVar158 = (float)((uint)bVar16 * auVar165._8_4_ | (uint)!bVar16 * auVar220._8_4_);
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            fVar162 = (float)((uint)bVar16 * auVar165._12_4_ | (uint)!bVar16 * auVar220._12_4_);
            auVar113 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar158,CONCAT44(fVar159,fVar156))));
            auVar146._0_4_ =
                 (float)((uint)(bVar103 & 1) * auVar128._0_4_ |
                        (uint)!(bool)(bVar103 & 1) * auVar110._0_4_);
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar146._4_4_ = (float)((uint)bVar16 * auVar128._4_4_ | (uint)!bVar16 * auVar110._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar146._8_4_ = (float)((uint)bVar16 * auVar128._8_4_ | (uint)!bVar16 * auVar110._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar146._12_4_ =
                 (float)((uint)bVar16 * auVar128._12_4_ | (uint)!bVar16 * auVar110._12_4_);
            fVar205 = (float)((uint)((byte)(uVar94 >> 4) & 1) * auVar128._16_4_);
            auVar146._16_4_ = fVar205;
            fVar197 = (float)((uint)((byte)(uVar94 >> 5) & 1) * auVar128._20_4_);
            auVar146._20_4_ = fVar197;
            fVar163 = (float)((uint)((byte)(uVar94 >> 6) & 1) * auVar128._24_4_);
            auVar146._24_4_ = fVar163;
            iVar1 = (uint)(byte)(uVar94 >> 7) * auVar128._28_4_;
            auVar146._28_4_ = iVar1;
            auVar129 = vblendmps_avx512vl(ZEXT1632(auVar28),auVar119);
            auVar147._0_4_ =
                 (uint)(bVar103 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar103 & 1) * auVar108._0_4_;
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar108._4_4_;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar108._8_4_;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar108._12_4_;
            auVar147._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * auVar129._16_4_;
            auVar147._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * auVar129._20_4_;
            auVar147._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * auVar129._24_4_;
            auVar147._28_4_ = (uint)(byte)(uVar94 >> 7) * auVar129._28_4_;
            auVar129 = vblendmps_avx512vl(ZEXT1632(auVar109),ZEXT1632(auVar106));
            auVar148._0_4_ =
                 (float)((uint)(bVar103 & 1) * auVar129._0_4_ |
                        (uint)!(bool)(bVar103 & 1) * auVar166._0_4_);
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar148._4_4_ = (float)((uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar166._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar148._8_4_ = (float)((uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar166._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar148._12_4_ =
                 (float)((uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar166._12_4_);
            fVar206 = (float)((uint)((byte)(uVar94 >> 4) & 1) * auVar129._16_4_);
            auVar148._16_4_ = fVar206;
            fVar183 = (float)((uint)((byte)(uVar94 >> 5) & 1) * auVar129._20_4_);
            auVar148._20_4_ = fVar183;
            fVar196 = (float)((uint)((byte)(uVar94 >> 6) & 1) * auVar129._24_4_);
            auVar148._24_4_ = fVar196;
            auVar148._28_4_ = (uint)(byte)(uVar94 >> 7) * auVar129._28_4_;
            auVar129 = vblendmps_avx512vl(ZEXT1632(auVar221),ZEXT1632(auVar10));
            auVar149._0_4_ =
                 (float)((uint)(bVar103 & 1) * auVar129._0_4_ |
                        (uint)!(bool)(bVar103 & 1) * auVar165._0_4_);
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar149._4_4_ = (float)((uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar165._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar149._8_4_ = (float)((uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar165._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar149._12_4_ =
                 (float)((uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar165._12_4_);
            fVar105 = (float)((uint)((byte)(uVar94 >> 4) & 1) * auVar129._16_4_);
            auVar149._16_4_ = fVar105;
            fVar104 = (float)((uint)((byte)(uVar94 >> 5) & 1) * auVar129._20_4_);
            auVar149._20_4_ = fVar104;
            fVar182 = (float)((uint)((byte)(uVar94 >> 6) & 1) * auVar129._24_4_);
            auVar149._24_4_ = fVar182;
            iVar2 = (uint)(byte)(uVar94 >> 7) * auVar129._28_4_;
            auVar149._28_4_ = iVar2;
            auVar150._0_4_ =
                 (uint)(bVar103 & 1) * (int)auVar28._0_4_ |
                 (uint)!(bool)(bVar103 & 1) * auVar119._0_4_;
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar16 * (int)auVar28._4_4_ | (uint)!bVar16 * auVar119._4_4_;
            bVar16 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar16 * (int)auVar28._8_4_ | (uint)!bVar16 * auVar119._8_4_;
            bVar16 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar16 * (int)auVar28._12_4_ | (uint)!bVar16 * auVar119._12_4_;
            auVar150._16_4_ = (uint)!(bool)((byte)(uVar94 >> 4) & 1) * auVar119._16_4_;
            auVar150._20_4_ = (uint)!(bool)((byte)(uVar94 >> 5) & 1) * auVar119._20_4_;
            auVar150._24_4_ = (uint)!(bool)((byte)(uVar94 >> 6) & 1) * auVar119._24_4_;
            auVar150._28_4_ = (uint)!SUB81(uVar94 >> 7,0) * auVar119._28_4_;
            bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar94 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar94 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar94 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar94 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar119 = vsubps_avx512vl(auVar150,auVar127);
            auVar130 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar109._12_4_ |
                                                     (uint)!bVar20 * auVar106._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar109._8_4_ |
                                                              (uint)!bVar18 * auVar106._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar109._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar106._4_4_,
                                                                       (uint)(bVar103 & 1) *
                                                                       (int)auVar109._0_4_ |
                                                                       (uint)!(bool)(bVar103 & 1) *
                                                                       auVar106._0_4_)))),auVar113);
            auVar128 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar221._12_4_ |
                                                     (uint)!bVar21 * auVar10._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar221._8_4_ |
                                                              (uint)!bVar19 * auVar10._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar221._4_4_ |
                                                                       (uint)!bVar17 * auVar10._4_4_
                                                                       ,(uint)(bVar103 & 1) *
                                                                        (int)auVar221._0_4_ |
                                                                        (uint)!(bool)(bVar103 & 1) *
                                                                        auVar10._0_4_)))),auVar146);
            auVar115 = vsubps_avx(auVar127,auVar147);
            auVar117 = vsubps_avx(auVar113,auVar148);
            auVar118 = vsubps_avx(auVar146,auVar149);
            auVar68._4_4_ = auVar128._4_4_ * fVar157;
            auVar68._0_4_ = auVar128._0_4_ * fVar155;
            auVar68._8_4_ = auVar128._8_4_ * fVar160;
            auVar68._12_4_ = auVar128._12_4_ * fVar161;
            auVar68._16_4_ = auVar128._16_4_ * 0.0;
            auVar68._20_4_ = auVar128._20_4_ * 0.0;
            auVar68._24_4_ = auVar128._24_4_ * 0.0;
            auVar68._28_4_ = 0;
            auVar108 = vfmsub231ps_fma(auVar68,auVar146,auVar119);
            auVar194._0_4_ = fVar156 * auVar119._0_4_;
            auVar194._4_4_ = fVar159 * auVar119._4_4_;
            auVar194._8_4_ = fVar158 * auVar119._8_4_;
            auVar194._12_4_ = fVar162 * auVar119._12_4_;
            auVar194._16_4_ = auVar119._16_4_ * 0.0;
            auVar194._20_4_ = auVar119._20_4_ * 0.0;
            auVar194._24_4_ = auVar119._24_4_ * 0.0;
            auVar194._28_4_ = 0;
            auVar166 = vfmsub231ps_fma(auVar194,auVar127,auVar130);
            auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar166),auVar123,ZEXT1632(auVar108));
            auVar201._0_4_ = auVar130._0_4_ * auVar146._0_4_;
            auVar201._4_4_ = auVar130._4_4_ * auVar146._4_4_;
            auVar201._8_4_ = auVar130._8_4_ * auVar146._8_4_;
            auVar201._12_4_ = auVar130._12_4_ * auVar146._12_4_;
            auVar201._16_4_ = auVar130._16_4_ * fVar205;
            auVar201._20_4_ = auVar130._20_4_ * fVar197;
            auVar201._24_4_ = auVar130._24_4_ * fVar163;
            auVar201._28_4_ = 0;
            auVar108 = vfmsub231ps_fma(auVar201,auVar113,auVar128);
            auVar120 = vfmadd231ps_avx512vl(auVar129,auVar123,ZEXT1632(auVar108));
            auVar129 = vmulps_avx512vl(auVar118,auVar147);
            auVar129 = vfmsub231ps_avx512vl(auVar129,auVar115,auVar149);
            auVar69._4_4_ = auVar117._4_4_ * auVar149._4_4_;
            auVar69._0_4_ = auVar117._0_4_ * auVar149._0_4_;
            auVar69._8_4_ = auVar117._8_4_ * auVar149._8_4_;
            auVar69._12_4_ = auVar117._12_4_ * auVar149._12_4_;
            auVar69._16_4_ = auVar117._16_4_ * fVar105;
            auVar69._20_4_ = auVar117._20_4_ * fVar104;
            auVar69._24_4_ = auVar117._24_4_ * fVar182;
            auVar69._28_4_ = iVar2;
            auVar108 = vfmsub231ps_fma(auVar69,auVar148,auVar118);
            auVar202._0_4_ = auVar148._0_4_ * auVar115._0_4_;
            auVar202._4_4_ = auVar148._4_4_ * auVar115._4_4_;
            auVar202._8_4_ = auVar148._8_4_ * auVar115._8_4_;
            auVar202._12_4_ = auVar148._12_4_ * auVar115._12_4_;
            auVar202._16_4_ = fVar206 * auVar115._16_4_;
            auVar202._20_4_ = fVar183 * auVar115._20_4_;
            auVar202._24_4_ = fVar196 * auVar115._24_4_;
            auVar202._28_4_ = 0;
            auVar166 = vfmsub231ps_fma(auVar202,auVar117,auVar147);
            auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar166),auVar123,auVar129);
            auVar121 = vfmadd231ps_avx512vl(auVar129,auVar123,ZEXT1632(auVar108));
            auVar129 = vmaxps_avx(auVar120,auVar121);
            uVar176 = vcmpps_avx512vl(auVar129,auVar123,2);
            local_430 = local_430 & (byte)uVar176;
            auVar233 = ZEXT3264(auVar215);
            if (local_430 == 0) {
LAB_01dc4e46:
              local_430 = 0;
            }
            else {
              auVar70._4_4_ = auVar118._4_4_ * auVar130._4_4_;
              auVar70._0_4_ = auVar118._0_4_ * auVar130._0_4_;
              auVar70._8_4_ = auVar118._8_4_ * auVar130._8_4_;
              auVar70._12_4_ = auVar118._12_4_ * auVar130._12_4_;
              auVar70._16_4_ = auVar118._16_4_ * auVar130._16_4_;
              auVar70._20_4_ = auVar118._20_4_ * auVar130._20_4_;
              auVar70._24_4_ = auVar118._24_4_ * auVar130._24_4_;
              auVar70._28_4_ = auVar129._28_4_;
              auVar165 = vfmsub231ps_fma(auVar70,auVar117,auVar128);
              auVar71._4_4_ = auVar128._4_4_ * auVar115._4_4_;
              auVar71._0_4_ = auVar128._0_4_ * auVar115._0_4_;
              auVar71._8_4_ = auVar128._8_4_ * auVar115._8_4_;
              auVar71._12_4_ = auVar128._12_4_ * auVar115._12_4_;
              auVar71._16_4_ = auVar128._16_4_ * auVar115._16_4_;
              auVar71._20_4_ = auVar128._20_4_ * auVar115._20_4_;
              auVar71._24_4_ = auVar128._24_4_ * auVar115._24_4_;
              auVar71._28_4_ = auVar128._28_4_;
              auVar166 = vfmsub231ps_fma(auVar71,auVar119,auVar118);
              auVar72._4_4_ = auVar117._4_4_ * auVar119._4_4_;
              auVar72._0_4_ = auVar117._0_4_ * auVar119._0_4_;
              auVar72._8_4_ = auVar117._8_4_ * auVar119._8_4_;
              auVar72._12_4_ = auVar117._12_4_ * auVar119._12_4_;
              auVar72._16_4_ = auVar117._16_4_ * auVar119._16_4_;
              auVar72._20_4_ = auVar117._20_4_ * auVar119._20_4_;
              auVar72._24_4_ = auVar117._24_4_ * auVar119._24_4_;
              auVar72._28_4_ = auVar117._28_4_;
              auVar106 = vfmsub231ps_fma(auVar72,auVar115,auVar130);
              auVar108 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar166),ZEXT1632(auVar106));
              auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar165),auVar123);
              auVar130 = vrcp14ps_avx512vl(auVar129);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = &DAT_3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              auVar34._16_4_ = 0x3f800000;
              auVar34._20_4_ = 0x3f800000;
              auVar34._24_4_ = 0x3f800000;
              auVar34._28_4_ = 0x3f800000;
              auVar128 = vfnmadd213ps_avx512vl(auVar130,auVar129,auVar34);
              auVar108 = vfmadd132ps_fma(auVar128,auVar130,auVar130);
              auVar73._4_4_ = auVar106._4_4_ * auVar146._4_4_;
              auVar73._0_4_ = auVar106._0_4_ * auVar146._0_4_;
              auVar73._8_4_ = auVar106._8_4_ * auVar146._8_4_;
              auVar73._12_4_ = auVar106._12_4_ * auVar146._12_4_;
              auVar73._16_4_ = fVar205 * 0.0;
              auVar73._20_4_ = fVar197 * 0.0;
              auVar73._24_4_ = fVar163 * 0.0;
              auVar73._28_4_ = iVar1;
              auVar166 = vfmadd231ps_fma(auVar73,auVar113,ZEXT1632(auVar166));
              auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar127,ZEXT1632(auVar165));
              fVar197 = auVar108._0_4_;
              fVar163 = auVar108._4_4_;
              fVar205 = auVar108._8_4_;
              fVar206 = auVar108._12_4_;
              auVar130 = ZEXT1632(CONCAT412(auVar166._12_4_ * fVar206,
                                            CONCAT48(auVar166._8_4_ * fVar205,
                                                     CONCAT44(auVar166._4_4_ * fVar163,
                                                              auVar166._0_4_ * fVar197))));
              auVar91._4_4_ = uStack_51c;
              auVar91._0_4_ = local_520;
              auVar91._8_4_ = uStack_518;
              auVar91._12_4_ = uStack_514;
              auVar91._16_4_ = uStack_510;
              auVar91._20_4_ = uStack_50c;
              auVar91._24_4_ = uStack_508;
              auVar91._28_4_ = uStack_504;
              uVar176 = vcmpps_avx512vl(auVar130,auVar91,0xd);
              uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar35._4_4_ = uVar164;
              auVar35._0_4_ = uVar164;
              auVar35._8_4_ = uVar164;
              auVar35._12_4_ = uVar164;
              auVar35._16_4_ = uVar164;
              auVar35._20_4_ = uVar164;
              auVar35._24_4_ = uVar164;
              auVar35._28_4_ = uVar164;
              uVar25 = vcmpps_avx512vl(auVar130,auVar35,2);
              local_430 = (byte)uVar176 & (byte)uVar25 & local_430;
              if (local_430 == 0) goto LAB_01dc4e46;
              uVar176 = vcmpps_avx512vl(auVar129,auVar123,4);
              if ((local_430 & (byte)uVar176) == 0) {
                local_430 = 0;
              }
              else {
                local_430 = local_430 & (byte)uVar176;
                fVar183 = auVar120._0_4_ * fVar197;
                fVar196 = auVar120._4_4_ * fVar163;
                auVar74._4_4_ = fVar196;
                auVar74._0_4_ = fVar183;
                fVar104 = auVar120._8_4_ * fVar205;
                auVar74._8_4_ = fVar104;
                fVar105 = auVar120._12_4_ * fVar206;
                auVar74._12_4_ = fVar105;
                fVar182 = auVar120._16_4_ * 0.0;
                auVar74._16_4_ = fVar182;
                fVar155 = auVar120._20_4_ * 0.0;
                auVar74._20_4_ = fVar155;
                fVar156 = auVar120._24_4_ * 0.0;
                auVar74._24_4_ = fVar156;
                auVar74._28_4_ = auVar120._28_4_;
                fVar197 = auVar121._0_4_ * fVar197;
                fVar163 = auVar121._4_4_ * fVar163;
                auVar75._4_4_ = fVar163;
                auVar75._0_4_ = fVar197;
                fVar205 = auVar121._8_4_ * fVar205;
                auVar75._8_4_ = fVar205;
                fVar206 = auVar121._12_4_ * fVar206;
                auVar75._12_4_ = fVar206;
                fVar157 = auVar121._16_4_ * 0.0;
                auVar75._16_4_ = fVar157;
                fVar159 = auVar121._20_4_ * 0.0;
                auVar75._20_4_ = fVar159;
                fVar160 = auVar121._24_4_ * 0.0;
                auVar75._24_4_ = fVar160;
                auVar75._28_4_ = auVar121._28_4_;
                auVar212._8_4_ = 0x3f800000;
                auVar212._0_8_ = &DAT_3f8000003f800000;
                auVar212._12_4_ = 0x3f800000;
                auVar212._16_4_ = 0x3f800000;
                auVar212._20_4_ = 0x3f800000;
                auVar212._24_4_ = 0x3f800000;
                auVar212._28_4_ = 0x3f800000;
                auVar129 = vsubps_avx512vl(auVar212,auVar74);
                bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar94 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar94 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar94 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar94 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar94 >> 6) & 1);
                bVar22 = SUB81(uVar94 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar22 * auVar120._28_4_ |
                                              (uint)!bVar22 * auVar129._28_4_,
                                              CONCAT424((uint)bVar21 * (int)fVar156 |
                                                        (uint)!bVar21 * auVar129._24_4_,
                                                        CONCAT420((uint)bVar20 * (int)fVar155 |
                                                                  (uint)!bVar20 * auVar129._20_4_,
                                                                  CONCAT416((uint)bVar19 *
                                                                            (int)fVar182 |
                                                                            (uint)!bVar19 *
                                                                            auVar129._16_4_,
                                                                            CONCAT412((uint)bVar18 *
                                                                                      (int)fVar105 |
                                                                                      (uint)!bVar18
                                                                                      * auVar129.
                                                  _12_4_,CONCAT48((uint)bVar17 * (int)fVar104 |
                                                                  (uint)!bVar17 * auVar129._8_4_,
                                                                  CONCAT44((uint)bVar16 *
                                                                           (int)fVar196 |
                                                                           (uint)!bVar16 *
                                                                           auVar129._4_4_,
                                                                           (uint)(bVar103 & 1) *
                                                                           (int)fVar183 |
                                                                           (uint)!(bool)(bVar103 & 1
                                                                                        ) *
                                                                           auVar129._0_4_))))))));
                auVar129 = vsubps_avx(auVar212,auVar75);
                bVar16 = (bool)((byte)(uVar94 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar94 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar94 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar94 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar94 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar94 >> 6) & 1);
                bVar22 = SUB81(uVar94 >> 7,0);
                local_380._4_4_ = (uint)bVar16 * (int)fVar163 | (uint)!bVar16 * auVar129._4_4_;
                local_380._0_4_ =
                     (uint)(bVar103 & 1) * (int)fVar197 |
                     (uint)!(bool)(bVar103 & 1) * auVar129._0_4_;
                local_380._8_4_ = (uint)bVar17 * (int)fVar205 | (uint)!bVar17 * auVar129._8_4_;
                local_380._12_4_ = (uint)bVar18 * (int)fVar206 | (uint)!bVar18 * auVar129._12_4_;
                local_380._16_4_ = (uint)bVar19 * (int)fVar157 | (uint)!bVar19 * auVar129._16_4_;
                local_380._20_4_ = (uint)bVar20 * (int)fVar159 | (uint)!bVar20 * auVar129._20_4_;
                local_380._24_4_ = (uint)bVar21 * (int)fVar160 | (uint)!bVar21 * auVar129._24_4_;
                local_380._28_4_ = (uint)bVar22 * auVar121._28_4_ | (uint)!bVar22 * auVar129._28_4_;
                in_ZMM21 = ZEXT3264(auVar130);
              }
            }
            auVar230 = ZEXT3264(local_6c0);
            if (local_430 != 0) {
              auVar129 = vsubps_avx(ZEXT1632(auVar107),auVar111);
              local_640 = in_ZMM20._0_32_;
              auVar129 = vfmadd213ps_avx512vl(auVar129,local_640,auVar111);
              auVar171._0_4_ = auVar129._0_4_ + auVar129._0_4_;
              auVar171._4_4_ = auVar129._4_4_ + auVar129._4_4_;
              auVar171._8_4_ = auVar129._8_4_ + auVar129._8_4_;
              auVar171._12_4_ = auVar129._12_4_ + auVar129._12_4_;
              auVar171._16_4_ = auVar129._16_4_ + auVar129._16_4_;
              auVar171._20_4_ = auVar129._20_4_ + auVar129._20_4_;
              auVar171._24_4_ = auVar129._24_4_ + auVar129._24_4_;
              auVar171._28_4_ = auVar129._28_4_ + auVar129._28_4_;
              uVar164 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar36._4_4_ = uVar164;
              auVar36._0_4_ = uVar164;
              auVar36._8_4_ = uVar164;
              auVar36._12_4_ = uVar164;
              auVar36._16_4_ = uVar164;
              auVar36._20_4_ = uVar164;
              auVar36._24_4_ = uVar164;
              auVar36._28_4_ = uVar164;
              auVar129 = vmulps_avx512vl(auVar171,auVar36);
              local_660 = in_ZMM21._0_32_;
              uVar176 = vcmpps_avx512vl(local_660,auVar129,6);
              local_430 = local_430 & (byte)uVar176;
              uVar98 = (uint)local_430;
              if (local_430 != 0) {
                auVar172._8_4_ = 0xbf800000;
                auVar172._0_8_ = 0xbf800000bf800000;
                auVar172._12_4_ = 0xbf800000;
                auVar172._16_4_ = 0xbf800000;
                auVar172._20_4_ = 0xbf800000;
                auVar172._24_4_ = 0xbf800000;
                auVar172._28_4_ = 0xbf800000;
                auVar37._8_4_ = 0x40000000;
                auVar37._0_8_ = 0x4000000040000000;
                auVar37._12_4_ = 0x40000000;
                auVar37._16_4_ = 0x40000000;
                auVar37._20_4_ = 0x40000000;
                auVar37._24_4_ = 0x40000000;
                auVar37._28_4_ = 0x40000000;
                local_4c0 = vfmadd132ps_avx512vl(local_380,auVar172,auVar37);
                local_380 = local_4c0;
                auVar129 = local_380;
                local_480 = (undefined4)lVar102;
                local_440 = CONCAT44(fStack_6dc,local_6e0);
                uStack_438 = CONCAT44(fStack_6d4,fStack_6d8);
                pGVar99 = (context->scene->geometries).items[uVar100].ptr;
                local_380 = auVar129;
                if ((pGVar99->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar129 = vaddps_avx512vl(local_640,_DAT_02020f40);
                  auVar108 = vcvtsi2ss_avx512f(auVar231._0_16_,local_480);
                  fVar197 = auVar108._0_4_;
                  local_420[0] = (fVar197 + auVar129._0_4_) * local_500;
                  local_420[1] = (fVar197 + auVar129._4_4_) * (float)auStack_4fc._0_4_;
                  local_420[2] = (fVar197 + auVar129._8_4_) * (float)auStack_4fc._4_4_;
                  local_420[3] = (fVar197 + auVar129._12_4_) * fStack_4f4;
                  fStack_410 = (fVar197 + auVar129._16_4_) * fStack_4f0;
                  fStack_40c = (fVar197 + auVar129._20_4_) * fStack_4ec;
                  fStack_408 = (fVar197 + auVar129._24_4_) * fStack_4e8;
                  fStack_404 = fVar197 + auVar129._28_4_;
                  local_380._0_8_ = local_4c0._0_8_;
                  local_380._8_8_ = local_4c0._8_8_;
                  local_380._16_8_ = local_4c0._16_8_;
                  local_380._24_8_ = local_4c0._24_8_;
                  local_400 = local_380._0_8_;
                  uStack_3f8 = local_380._8_8_;
                  uStack_3f0 = local_380._16_8_;
                  uStack_3e8 = local_380._24_8_;
                  local_3e0 = local_660;
                  auVar173._8_4_ = 0x7f800000;
                  auVar173._0_8_ = 0x7f8000007f800000;
                  auVar173._12_4_ = 0x7f800000;
                  auVar173._16_4_ = 0x7f800000;
                  auVar173._20_4_ = 0x7f800000;
                  auVar173._24_4_ = 0x7f800000;
                  auVar173._28_4_ = 0x7f800000;
                  auVar129 = vblendmps_avx512vl(auVar173,local_660);
                  auVar151._0_4_ =
                       (uint)(local_430 & 1) * auVar129._0_4_ |
                       (uint)!(bool)(local_430 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_430 >> 1 & 1);
                  auVar151._4_4_ = (uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_430 >> 2 & 1);
                  auVar151._8_4_ = (uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_430 >> 3 & 1);
                  auVar151._12_4_ = (uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_430 >> 4 & 1);
                  auVar151._16_4_ = (uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_430 >> 5 & 1);
                  auVar151._20_4_ = (uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_430 >> 6 & 1);
                  auVar151._24_4_ = (uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar151._28_4_ =
                       (uint)(local_430 >> 7) * auVar129._28_4_ |
                       (uint)!(bool)(local_430 >> 7) * 0x7f800000;
                  auVar129 = vshufps_avx(auVar151,auVar151,0xb1);
                  auVar129 = vminps_avx(auVar151,auVar129);
                  auVar130 = vshufpd_avx(auVar129,auVar129,5);
                  auVar129 = vminps_avx(auVar129,auVar130);
                  auVar130 = vpermpd_avx2(auVar129,0x4e);
                  auVar129 = vminps_avx(auVar129,auVar130);
                  uVar176 = vcmpps_avx512vl(auVar151,auVar129,0);
                  bVar93 = (byte)uVar176 & local_430;
                  bVar103 = local_430;
                  if (bVar93 != 0) {
                    bVar103 = bVar93;
                  }
                  uVar96 = 0;
                  for (uVar95 = (uint)bVar103; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000)
                  {
                    uVar96 = uVar96 + 1;
                  }
                  uVar94 = (ulong)uVar96;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar99->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar197 = local_420[uVar94];
                    uVar164 = *(undefined4 *)((long)&local_400 + uVar94 * 4);
                    fVar163 = 1.0 - fVar197;
                    auVar165 = vfnmadd231ss_fma(ZEXT416((uint)(fVar197 * (fVar163 + fVar163))),
                                                ZEXT416((uint)fVar163),ZEXT416((uint)fVar163));
                    auVar166 = ZEXT416((uint)fVar197);
                    auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar166,
                                               ZEXT416(0xc0a00000));
                    auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197 * 3.0)),
                                               ZEXT416((uint)(fVar197 + fVar197)),auVar108);
                    auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar166,
                                               ZEXT416(0x40000000));
                    auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163 * -3.0)),
                                               ZEXT416((uint)(fVar163 + fVar163)),auVar108);
                    auVar166 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar166,
                                               ZEXT416((uint)(fVar163 * -2.0)));
                    fVar163 = auVar165._0_4_ * 0.5;
                    fVar205 = auVar107._0_4_ * 0.5;
                    fVar206 = auVar108._0_4_ * 0.5;
                    fVar183 = auVar166._0_4_ * 0.5;
                    auVar187._0_4_ = fVar183 * local_6e0;
                    auVar187._4_4_ = fVar183 * fStack_6dc;
                    auVar187._8_4_ = fVar183 * fStack_6d8;
                    auVar187._12_4_ = fVar183 * fStack_6d4;
                    auVar208._4_4_ = fVar206;
                    auVar208._0_4_ = fVar206;
                    auVar208._8_4_ = fVar206;
                    auVar208._12_4_ = fVar206;
                    auVar108 = vfmadd132ps_fma(auVar208,auVar187,auVar8);
                    auVar188._4_4_ = fVar205;
                    auVar188._0_4_ = fVar205;
                    auVar188._8_4_ = fVar205;
                    auVar188._12_4_ = fVar205;
                    auVar108 = vfmadd132ps_fma(auVar188,auVar108,auVar9);
                    auVar181._4_4_ = fVar163;
                    auVar181._0_4_ = fVar163;
                    auVar181._8_4_ = fVar163;
                    auVar181._12_4_ = fVar163;
                    auVar108 = vfmadd213ps_fma(auVar181,auVar23,auVar108);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar94 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar108._0_4_;
                    uVar14 = vextractps_avx(auVar108,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar14;
                    uVar14 = vextractps_avx(auVar108,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar14;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar197;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar164;
                    *(uint *)(ray + k * 4 + 0x220) = uVar12;
                    *(uint *)(ray + k * 4 + 0x240) = uVar100;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_600 = (float)uVar81;
                    fStack_5fc = (float)((ulong)uVar81 >> 0x20);
                    fStack_5f8 = (float)uVar82;
                    fStack_5f4 = (float)((ulong)uVar82 >> 0x20);
                    local_330 = local_440;
                    uStack_328 = uStack_438;
                    local_6d0 = pGVar99;
                    local_5f0 = uVar24;
                    uStack_5e8 = uVar26;
                    local_4e0 = local_640;
                    local_4a0 = local_660;
                    local_47c = iVar13;
                    local_470 = auVar23;
                    local_460 = uVar24;
                    uStack_458 = uVar26;
                    local_450 = uVar81;
                    uStack_448 = uVar82;
                    do {
                      auVar106 = auVar234._0_16_;
                      local_5e0 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar197 = local_420[uVar94];
                      auVar177._4_4_ = fVar197;
                      auVar177._0_4_ = fVar197;
                      auVar177._8_4_ = fVar197;
                      auVar177._12_4_ = fVar197;
                      local_280._16_4_ = fVar197;
                      local_280._0_16_ = auVar177;
                      local_280._20_4_ = fVar197;
                      local_280._24_4_ = fVar197;
                      local_280._28_4_ = fVar197;
                      local_260 = *(undefined4 *)((long)&local_400 + uVar94 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar94 * 4)
                      ;
                      local_710.context = context->user;
                      fVar163 = 1.0 - fVar197;
                      auVar165 = vfnmadd231ss_fma(ZEXT416((uint)(fVar197 * (fVar163 + fVar163))),
                                                  ZEXT416((uint)fVar163),ZEXT416((uint)fVar163));
                      auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar177,
                                                 ZEXT416(0xc0a00000));
                      auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197 * 3.0)),
                                                 ZEXT416((uint)(fVar197 + fVar197)),auVar108);
                      auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar177,
                                                 ZEXT416(0x40000000));
                      auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163 * -3.0)),
                                                 ZEXT416((uint)(fVar163 + fVar163)),auVar108);
                      auVar166 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),auVar177,
                                                 ZEXT416((uint)(fVar163 * -2.0)));
                      fVar197 = auVar165._0_4_ * 0.5;
                      fVar163 = auVar107._0_4_ * 0.5;
                      fVar205 = auVar108._0_4_ * 0.5;
                      fVar206 = auVar166._0_4_ * 0.5;
                      auVar189._0_4_ = fVar206 * (float)local_330;
                      auVar189._4_4_ = fVar206 * local_330._4_4_;
                      auVar189._8_4_ = fVar206 * (float)uStack_328;
                      auVar189._12_4_ = fVar206 * uStack_328._4_4_;
                      auVar209._4_4_ = fVar205;
                      auVar209._0_4_ = fVar205;
                      auVar209._8_4_ = fVar205;
                      auVar209._12_4_ = fVar205;
                      auVar87._4_4_ = fStack_5fc;
                      auVar87._0_4_ = local_600;
                      auVar87._8_4_ = fStack_5f8;
                      auVar87._12_4_ = fStack_5f4;
                      auVar108 = vfmadd132ps_fma(auVar209,auVar189,auVar87);
                      auVar190._4_4_ = fVar163;
                      auVar190._0_4_ = fVar163;
                      auVar190._8_4_ = fVar163;
                      auVar190._12_4_ = fVar163;
                      auVar88._8_8_ = uStack_5e8;
                      auVar88._0_8_ = local_5f0;
                      auVar108 = vfmadd132ps_fma(auVar190,auVar108,auVar88);
                      auVar167._4_4_ = fVar197;
                      auVar167._0_4_ = fVar197;
                      auVar167._8_4_ = fVar197;
                      auVar167._12_4_ = fVar197;
                      auVar108 = vfmadd213ps_fma(auVar167,auVar23,auVar108);
                      local_2e0 = auVar108._0_4_;
                      auVar203._8_4_ = 1;
                      auVar203._0_8_ = 0x100000001;
                      auVar203._12_4_ = 1;
                      auVar203._16_4_ = 1;
                      auVar203._20_4_ = 1;
                      auVar203._24_4_ = 1;
                      auVar203._28_4_ = 1;
                      local_2c0 = vpermps_avx2(auVar203,ZEXT1632(auVar108));
                      auVar213._8_4_ = 2;
                      auVar213._0_8_ = 0x200000002;
                      auVar213._12_4_ = 2;
                      auVar213._16_4_ = 2;
                      auVar213._20_4_ = 2;
                      auVar213._24_4_ = 2;
                      auVar213._28_4_ = 2;
                      local_2a0 = vpermps_avx2(auVar213,ZEXT1632(auVar108));
                      iStack_2dc = local_2e0;
                      iStack_2d8 = local_2e0;
                      iStack_2d4 = local_2e0;
                      iStack_2d0 = local_2e0;
                      iStack_2cc = local_2e0;
                      iStack_2c8 = local_2e0;
                      iStack_2c4 = local_2e0;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      local_240 = local_3c0._0_8_;
                      uStack_238 = local_3c0._8_8_;
                      uStack_230 = local_3c0._16_8_;
                      uStack_228 = local_3c0._24_8_;
                      local_220 = local_3a0;
                      auVar129 = vpcmpeqd_avx2(local_3a0,local_3a0);
                      local_6c8[1] = auVar129;
                      *local_6c8 = auVar129;
                      local_200 = (local_710.context)->instID[0];
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = (local_710.context)->instPrimID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_620 = local_320._0_8_;
                      uStack_618 = local_320._8_8_;
                      uStack_610 = local_320._16_8_;
                      uStack_608 = local_320._24_8_;
                      local_710.valid = (int *)&local_620;
                      local_710.geometryUserPtr = pGVar99->userPtr;
                      local_710.hit = (RTCHitN *)&local_2e0;
                      local_710.N = 8;
                      local_540._0_4_ = uVar98;
                      local_710.ray = (RTCRayN *)ray;
                      if (pGVar99->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar99->intersectionFilterN)(&local_710);
                        auVar236 = ZEXT3264(local_6a0);
                        auVar235 = ZEXT3264(local_680);
                        auVar230 = ZEXT3264(local_6c0);
                        auVar233 = ZEXT3264(local_5a0);
                        auVar232 = ZEXT3264(local_580);
                        in_ZMM21 = ZEXT3264(local_660);
                        in_ZMM20 = ZEXT3264(local_640);
                        auVar108 = vxorps_avx512vl(auVar106,auVar106);
                        auVar234 = ZEXT1664(auVar108);
                        pGVar99 = local_6d0;
                        uVar98 = local_540._0_4_;
                      }
                      bVar103 = (byte)uVar98;
                      auVar108 = auVar234._0_16_;
                      auVar83._8_8_ = uStack_618;
                      auVar83._0_8_ = local_620;
                      auVar83._16_8_ = uStack_610;
                      auVar83._24_8_ = uStack_608;
                      if (auVar83 == (undefined1  [32])0x0) {
LAB_01dc52dc:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_5e0;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar99->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_710);
                          bVar103 = local_540[0];
                          auVar236 = ZEXT3264(local_6a0);
                          auVar235 = ZEXT3264(local_680);
                          auVar230 = ZEXT3264(local_6c0);
                          auVar233 = ZEXT3264(local_5a0);
                          auVar232 = ZEXT3264(local_580);
                          in_ZMM21 = ZEXT3264(local_660);
                          in_ZMM20 = ZEXT3264(local_640);
                          auVar108 = vxorps_avx512vl(auVar108,auVar108);
                          auVar234 = ZEXT1664(auVar108);
                          pGVar99 = local_6d0;
                        }
                        auVar84._8_8_ = uStack_618;
                        auVar84._0_8_ = local_620;
                        auVar84._16_8_ = uStack_610;
                        auVar84._24_8_ = uStack_608;
                        if (auVar84 == (undefined1  [32])0x0) goto LAB_01dc52dc;
                        uVar97 = vptestmd_avx512vl(auVar84,auVar84);
                        iVar1 = *(int *)(local_710.hit + 4);
                        iVar2 = *(int *)(local_710.hit + 8);
                        iVar76 = *(int *)(local_710.hit + 0xc);
                        iVar77 = *(int *)(local_710.hit + 0x10);
                        iVar78 = *(int *)(local_710.hit + 0x14);
                        iVar79 = *(int *)(local_710.hit + 0x18);
                        iVar80 = *(int *)(local_710.hit + 0x1c);
                        bVar93 = (byte)uVar97;
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar22 = SUB81(uVar97 >> 7,0);
                        *(uint *)(local_710.ray + 0x180) =
                             (uint)(bVar93 & 1) * *(int *)local_710.hit |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x180);
                        *(uint *)(local_710.ray + 0x184) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x184);
                        *(uint *)(local_710.ray + 0x188) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x188);
                        *(uint *)(local_710.ray + 0x18c) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x18c)
                        ;
                        *(uint *)(local_710.ray + 400) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 400);
                        *(uint *)(local_710.ray + 0x194) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 0x194)
                        ;
                        *(uint *)(local_710.ray + 0x198) =
                             (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x198)
                        ;
                        *(uint *)(local_710.ray + 0x19c) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_710.hit + 0x24);
                        iVar2 = *(int *)(local_710.hit + 0x28);
                        iVar76 = *(int *)(local_710.hit + 0x2c);
                        iVar77 = *(int *)(local_710.hit + 0x30);
                        iVar78 = *(int *)(local_710.hit + 0x34);
                        iVar79 = *(int *)(local_710.hit + 0x38);
                        iVar80 = *(int *)(local_710.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar22 = SUB81(uVar97 >> 7,0);
                        *(uint *)(local_710.ray + 0x1a0) =
                             (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x20) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x1a0);
                        *(uint *)(local_710.ray + 0x1a4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x1a4);
                        *(uint *)(local_710.ray + 0x1a8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x1a8);
                        *(uint *)(local_710.ray + 0x1ac) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x1ac)
                        ;
                        *(uint *)(local_710.ray + 0x1b0) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 0x1b0)
                        ;
                        *(uint *)(local_710.ray + 0x1b4) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 0x1b4)
                        ;
                        *(uint *)(local_710.ray + 0x1b8) =
                             (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x1b8)
                        ;
                        *(uint *)(local_710.ray + 0x1bc) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_710.hit + 0x44);
                        iVar2 = *(int *)(local_710.hit + 0x48);
                        iVar76 = *(int *)(local_710.hit + 0x4c);
                        iVar77 = *(int *)(local_710.hit + 0x50);
                        iVar78 = *(int *)(local_710.hit + 0x54);
                        iVar79 = *(int *)(local_710.hit + 0x58);
                        iVar80 = *(int *)(local_710.hit + 0x5c);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar22 = SUB81(uVar97 >> 7,0);
                        *(uint *)(local_710.ray + 0x1c0) =
                             (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x40) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x1c0);
                        *(uint *)(local_710.ray + 0x1c4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x1c4);
                        *(uint *)(local_710.ray + 0x1c8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x1c8);
                        *(uint *)(local_710.ray + 0x1cc) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x1cc)
                        ;
                        *(uint *)(local_710.ray + 0x1d0) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 0x1d0)
                        ;
                        *(uint *)(local_710.ray + 0x1d4) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 0x1d4)
                        ;
                        *(uint *)(local_710.ray + 0x1d8) =
                             (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x1d8)
                        ;
                        *(uint *)(local_710.ray + 0x1dc) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_710.hit + 100);
                        iVar2 = *(int *)(local_710.hit + 0x68);
                        iVar76 = *(int *)(local_710.hit + 0x6c);
                        iVar77 = *(int *)(local_710.hit + 0x70);
                        iVar78 = *(int *)(local_710.hit + 0x74);
                        iVar79 = *(int *)(local_710.hit + 0x78);
                        iVar80 = *(int *)(local_710.hit + 0x7c);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar22 = SUB81(uVar97 >> 7,0);
                        *(uint *)(local_710.ray + 0x1e0) =
                             (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x60) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x1e0);
                        *(uint *)(local_710.ray + 0x1e4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x1e4);
                        *(uint *)(local_710.ray + 0x1e8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x1e8);
                        *(uint *)(local_710.ray + 0x1ec) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x1ec)
                        ;
                        *(uint *)(local_710.ray + 0x1f0) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 0x1f0)
                        ;
                        *(uint *)(local_710.ray + 500) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 500);
                        *(uint *)(local_710.ray + 0x1f8) =
                             (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x1f8)
                        ;
                        *(uint *)(local_710.ray + 0x1fc) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_710.hit + 0x84);
                        iVar2 = *(int *)(local_710.hit + 0x88);
                        iVar76 = *(int *)(local_710.hit + 0x8c);
                        iVar77 = *(int *)(local_710.hit + 0x90);
                        iVar78 = *(int *)(local_710.hit + 0x94);
                        iVar79 = *(int *)(local_710.hit + 0x98);
                        iVar80 = *(int *)(local_710.hit + 0x9c);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar22 = SUB81(uVar97 >> 7,0);
                        *(uint *)(local_710.ray + 0x200) =
                             (uint)(bVar93 & 1) * *(int *)(local_710.hit + 0x80) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_710.ray + 0x200);
                        *(uint *)(local_710.ray + 0x204) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_710.ray + 0x204);
                        *(uint *)(local_710.ray + 0x208) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_710.ray + 0x208);
                        *(uint *)(local_710.ray + 0x20c) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_710.ray + 0x20c)
                        ;
                        *(uint *)(local_710.ray + 0x210) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_710.ray + 0x210)
                        ;
                        *(uint *)(local_710.ray + 0x214) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_710.ray + 0x214)
                        ;
                        *(uint *)(local_710.ray + 0x218) =
                             (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_710.ray + 0x218)
                        ;
                        *(uint *)(local_710.ray + 0x21c) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_710.ray + 0x21c)
                        ;
                        auVar129 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0xa0));
                        *(undefined1 (*) [32])(local_710.ray + 0x220) = auVar129;
                        auVar129 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0xc0));
                        *(undefined1 (*) [32])(local_710.ray + 0x240) = auVar129;
                        auVar129 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0xe0));
                        *(undefined1 (*) [32])(local_710.ray + 0x260) = auVar129;
                        auVar129 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_710.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_710.ray + 0x280) = auVar129;
                      }
                      bVar103 = ~(byte)(1 << ((uint)uVar94 & 0x1f)) & bVar103;
                      uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar38._4_4_ = uVar164;
                      auVar38._0_4_ = uVar164;
                      auVar38._8_4_ = uVar164;
                      auVar38._12_4_ = uVar164;
                      auVar38._16_4_ = uVar164;
                      auVar38._20_4_ = uVar164;
                      auVar38._24_4_ = uVar164;
                      auVar38._28_4_ = uVar164;
                      uVar176 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar38,2);
                      bVar93 = bVar103 & (byte)uVar176;
                      uVar98 = (uint)bVar93;
                      if ((bVar103 & (byte)uVar176) != 0) {
                        auVar174._8_4_ = 0x7f800000;
                        auVar174._0_8_ = 0x7f8000007f800000;
                        auVar174._12_4_ = 0x7f800000;
                        auVar174._16_4_ = 0x7f800000;
                        auVar174._20_4_ = 0x7f800000;
                        auVar174._24_4_ = 0x7f800000;
                        auVar174._28_4_ = 0x7f800000;
                        auVar129 = vblendmps_avx512vl(auVar174,in_ZMM21._0_32_);
                        auVar152._0_4_ =
                             (uint)(bVar93 & 1) * auVar129._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 1 & 1);
                        auVar152._4_4_ = (uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 2 & 1);
                        auVar152._8_4_ = (uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 3 & 1);
                        auVar152._12_4_ =
                             (uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 4 & 1);
                        auVar152._16_4_ =
                             (uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 5 & 1);
                        auVar152._20_4_ =
                             (uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar93 >> 6 & 1);
                        auVar152._24_4_ =
                             (uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar152._28_4_ =
                             (uint)(bVar93 >> 7) * auVar129._28_4_ |
                             (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                        auVar129 = vshufps_avx(auVar152,auVar152,0xb1);
                        auVar129 = vminps_avx(auVar152,auVar129);
                        auVar130 = vshufpd_avx(auVar129,auVar129,5);
                        auVar129 = vminps_avx(auVar129,auVar130);
                        auVar130 = vpermpd_avx2(auVar129,0x4e);
                        auVar129 = vminps_avx(auVar129,auVar130);
                        uVar176 = vcmpps_avx512vl(auVar152,auVar129,0);
                        bVar103 = (byte)uVar176 & bVar93;
                        uVar96 = uVar98;
                        if (bVar103 != 0) {
                          uVar96 = (uint)bVar103;
                        }
                        uVar95 = 0;
                        for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                          uVar95 = uVar95 + 1;
                        }
                        uVar94 = (ulong)uVar95;
                      }
                    } while (bVar93 != 0);
                  }
                }
              }
            }
          }
          auVar216 = ZEXT3264(auVar114);
          auVar195 = ZEXT3264(auVar116);
          lVar102 = lVar102 + 8;
          auVar231 = auVar233;
        } while ((int)lVar102 < iVar13);
      }
      uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar33._4_4_ = uVar164;
      auVar33._0_4_ = uVar164;
      auVar33._8_4_ = uVar164;
      auVar33._12_4_ = uVar164;
      auVar33._16_4_ = uVar164;
      auVar33._20_4_ = uVar164;
      auVar33._24_4_ = uVar164;
      auVar33._28_4_ = uVar164;
      uVar24 = vcmpps_avx512vl(local_80,auVar33,2);
      uVar100 = (uint)uVar101 & (uint)uVar24;
      uVar101 = (ulong)uVar100;
    } while (uVar100 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }